

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::RALocalAllocator::replaceAssignment
          (RALocalAllocator *this,PhysToWorkMap *physToWorkMap)

{
  RAAssignment *this_00;
  uint **ppuVar1;
  byte bVar2;
  BaseNode BVar3;
  BaseNode BVar4;
  InstNode IVar5;
  char *pcVar6;
  long lVar7;
  BaseNode *pBVar8;
  WorkToPhysMap *__src;
  PhysToWorkMap *pPVar9;
  uint *puVar10;
  undefined1 *puVar11;
  ZoneAllocator *pZVar12;
  undefined4 workId;
  RegGroup RVar13;
  Error EVar14;
  int iVar15;
  uint uVar16;
  Error extraout_EAX;
  uint32_t uVar17;
  long lVar18;
  ulong uVar19;
  RAStackSlot *pRVar20;
  PhysToWorkMap *pPVar21;
  BaseRAPass *pBVar22;
  RABlock *pRVar23;
  BaseNode *pBVar24;
  byte bVar25;
  uint uVar26;
  uint uVar27;
  BaseRAPass *pBVar28;
  BaseRAPass *pBVar29;
  uint extraout_EDX;
  uint extraout_EDX_00;
  long *extraout_RDX;
  uint *puVar30;
  ulong uVar31;
  BaseRAPass *pBVar32;
  BaseRAPass *extraout_RDX_00;
  BaseRAPass *extraout_RDX_01;
  BaseRAPass *extraout_RDX_02;
  BaseRAPass *extraout_RDX_03;
  BaseRAPass *extraout_RDX_04;
  BaseRAPass *extraout_RDX_05;
  BaseRAPass *extraout_RDX_06;
  BaseRAPass *extraout_RDX_07;
  BaseRAPass *pBVar33;
  RABlock *block;
  uint uVar34;
  BaseRAPass *pBVar35;
  ulong unaff_RBP;
  BaseRAPass *pBVar36;
  uint uVar37;
  BaseRAPass *pBVar38;
  InstNode *pIVar39;
  BaseRAPass *pBVar40;
  BaseRAPass *pBVar41;
  BaseRAPass *pBVar42;
  BaseRAPass *pBVar43;
  BaseCompiler *pBVar44;
  BaseRAPass *pBVar45;
  uint uVar46;
  BaseRAPass *pBVar47;
  uint uVar48;
  uint uVar49;
  uint *puVar50;
  _func_int **pp_Var51;
  long lVar52;
  BaseRAPass *unaff_R12;
  BaseRAPass *unaff_R13;
  BaseRAPass *pBVar53;
  InstNode *pIVar54;
  ulong unaff_R14;
  BaseRAPass *pBVar55;
  BaseRAPass *pBVar56;
  WorkToPhysMap *unaff_R15;
  BaseRAPass *pBVar57;
  BaseRAPass *pBVar58;
  bool bVar59;
  char cVar60;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined8 uStack_508;
  undefined8 uStack_500;
  long lStack_4f0;
  BaseRAPass *pBStack_4e8;
  InstNode *pIStack_4e0;
  BaseRAPass *pBStack_4d8;
  long lStack_4d0;
  BaseRAPass *pBStack_4c8;
  ulong uStack_4b8;
  BaseRAPass *pBStack_4b0;
  InstNode *pIStack_4a8;
  BaseRAPass *pBStack_4a0;
  BaseRAPass *pBStack_498;
  BaseRAPass *pBStack_490;
  BaseRAPass *pBStack_488;
  BaseRAPass *pBStack_480;
  BaseRAPass *pBStack_478;
  BaseRAPass *pBStack_470;
  BaseRAPass *pBStack_468;
  BaseRAPass *pBStack_460;
  BaseRAPass *pBStack_458;
  BaseRAPass *pBStack_450;
  BaseRAPass *pBStack_448;
  BaseRAPass *pBStack_440;
  code *pcStack_438;
  BaseRAPass *pBStack_430;
  BaseRAPass *pBStack_428;
  uint uStack_420;
  uint uStack_41c;
  BaseRAPass *pBStack_418;
  char cStack_40d;
  uint uStack_40c;
  BaseRAPass *pBStack_408;
  BaseRAPass *pBStack_400;
  BaseRAPass *pBStack_3f8;
  uint uStack_3ec;
  BaseRAPass *pBStack_3e8;
  BaseRAPass *pBStack_3e0;
  BaseRAPass *pBStack_3d8;
  _func_int **pp_Stack_3d0;
  BaseRAPass *pBStack_3c8;
  uint uStack_3bc;
  BaseRAPass *pBStack_3b8;
  InstNode *pIStack_3b0;
  ulong uStack_3a8;
  BaseRAPass *pBStack_3a0;
  ulong uStack_398;
  undefined1 auStack_390 [64];
  long alStack_350 [32];
  undefined8 auStack_250 [33];
  BaseRAPass *pBStack_148;
  BaseRAPass *pBStack_140;
  BaseRAPass *pBStack_138;
  ulong uStack_130;
  RAAssignment *pRStack_128;
  BaseRAPass *pBStack_120;
  RALocalAllocator *pRStack_118;
  BaseRAPass *pBStack_110;
  ulong uStack_108;
  WorkToPhysMap *pWStack_100;
  code *pcStack_f8;
  BaseRAPass *pBStack_f0;
  uint uStack_e4;
  BaseRAPass *pBStack_e0;
  char cStack_d4;
  RAAssignment *pRStack_d0;
  uint *puStack_c8;
  BaseRAPass *pBStack_c0;
  long *plStack_b8;
  BaseRAPass *pBStack_b0;
  uint uStack_a8;
  char cStack_a4;
  uint *puStack_a0;
  ulong uStack_98;
  ArchTraits **ppAStack_90;
  WorkToPhysMap *pWStack_88;
  anon_union_4_2_ebeb14a8_for_RARegCount_0 aStack_80;
  uint uStack_7c;
  int iStack_78;
  uint uStack_74;
  RAWorkRegs *pRStack_70;
  WorkToPhysMap *pWStack_68;
  BaseRAPass *pBStack_60;
  uint *apuStack_58 [4];
  RALocalAllocator *pRStack_38;
  
  memcpy((this->_curAssignment)._physToWorkMap,physToWorkMap,
         (ulong)(this->_curAssignment)._layout.physTotal * 4 + 0x20);
  memset((this->_curAssignment)._workToPhysMap,0xff,(ulong)(this->_curAssignment)._layout.workCount)
  ;
  lVar18 = 0;
  _cStack_a4 = 0xffffffff;
  while (uVar46 = (((this->_curAssignment)._physToWorkMap)->assigned)._masks._data[lVar18],
        uVar46 == 0) {
LAB_00121bdf:
    lVar18 = lVar18 + 1;
    if (lVar18 == 4) {
      return 0;
    }
  }
  bVar25 = *(byte *)((long)(this->_curAssignment)._physToWorkIds._data + lVar18 + -0x28);
  pBVar33 = (BaseRAPass *)(ulong)bVar25;
  while( true ) {
    uVar37 = 0;
    if (uVar46 != 0) {
      for (; (uVar46 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
      }
    }
    pBVar35 = (BaseRAPass *)(ulong)uVar37;
    pBVar47 = (BaseRAPass *)(ulong)(uVar37 + bVar25);
    pBVar45 = (BaseRAPass *)(ulong)((this->_curAssignment)._physToWorkMap)->workIds[(long)pBVar47];
    if (pBVar45 == (BaseRAPass *)0xffffffff) break;
    (this->_curAssignment)._workToPhysMap[(long)pBVar45].physIds[0] = (uint8_t)uVar37;
    uVar46 = uVar46 - 1 & uVar46;
    if (uVar46 == 0) goto LAB_00121bdf;
  }
  replaceAssignment();
  _cStack_d4 = SUB84(pBVar45,0);
  apuStack_58[2] = (uint *)0x0;
  apuStack_58[3] = (uint *)0x0;
  apuStack_58[0] = (uint *)0x0;
  apuStack_58[1] = (uint *)0x0;
  pBVar36 = (BaseRAPass *)(pBVar35->super_FuncPass).super_Pass._vptr_Pass;
  bVar25 = (pBVar36->_physRegCount).field_0._regs[0];
  uVar46 = (uint)(pBVar36->_physRegCount).field_0._regs[1] + (uint)bVar25;
  pBVar38 = pBVar33;
  pRStack_38 = this;
  if (0xff < uVar46) goto LAB_00122384;
  uVar37 = (pBVar36->_physRegCount).field_0._regs[2] + uVar46;
  unaff_R12 = pBVar33;
  if (0xff < uVar37) goto LAB_00122389;
  pRStack_d0 = (RAAssignment *)&pBVar35->field_0x48;
  pRStack_70 = &pBVar36->_workRegs;
  aStack_80._packed = uVar37 * 0x1000000 | uVar46 * 0x10000 | (uint)bVar25 << 8;
  uStack_7c = (pBVar36->_physRegCount).field_0._packed;
  iStack_78 = (uStack_7c >> 0x18) + uVar37;
  uStack_74 = *(uint *)&pBVar36->field_0x148;
  uVar31 = (ulong)uStack_74;
  unaff_R15 = (WorkToPhysMap *)pBVar35->_lastTimestamp;
  lVar18 = 0;
  do {
    *(uint **)((long)apuStack_58 + lVar18) =
         (((RARegMask *)&pBVar33->_allocator)->_masks)._data +
         (ulong)(aStack_80._packed >> ((byte)lVar18 & 0x1f) & 0xff) + 2;
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x20);
  pBVar38 = (BaseRAPass *)0xff;
  pcStack_f8 = (code *)0x121cf2;
  pBStack_f0 = pBVar35;
  plStack_b8 = extraout_RDX;
  pWStack_68 = unaff_R15;
  pBStack_60 = pBVar33;
  memset(unaff_R15,0xff,uVar31);
  lVar18 = 0;
  do {
    uVar46 = (((RARegMask *)&pBVar33->_allocator)->_masks)._data[lVar18 + -6];
    if (uVar46 != 0) {
      bVar25 = aStack_80._regs[lVar18];
      pBVar38 = (BaseRAPass *)(ulong)bVar25;
      while( true ) {
        iVar15 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
          }
        }
        uVar19 = (ulong)(((RARegMask *)&pBVar33->_allocator)->_masks)._data
                        [(ulong)(iVar15 + (uint)bVar25) + 2];
        if (uVar19 == 0xffffffff) break;
        unaff_R15[uVar19].physIds[0] = (uint8_t)iVar15;
        uVar46 = uVar46 - 1 & uVar46;
        if (uVar46 == 0) goto LAB_00121d2a;
      }
      pcStack_f8 = (code *)0x122331;
      switchToAssignment();
LAB_00122331:
      pcStack_f8 = (code *)0x122336;
      switchToAssignment();
LAB_00122336:
      pcStack_f8 = (code *)0x12233b;
      switchToAssignment();
LAB_0012233b:
      pcStack_f8 = (code *)0x122340;
      switchToAssignment();
LAB_00122340:
      pcStack_f8 = (code *)0x122345;
      switchToAssignment();
LAB_00122345:
      pcStack_f8 = (code *)0x12234a;
      switchToAssignment();
LAB_0012234a:
      pcStack_f8 = (code *)0x12234f;
      switchToAssignment();
LAB_0012234f:
      pcStack_f8 = (code *)0x122354;
      switchToAssignment();
LAB_00122354:
      pcStack_f8 = (code *)0x122359;
      switchToAssignment();
LAB_00122359:
      pcStack_f8 = (code *)0x12235e;
      switchToAssignment();
LAB_0012235e:
      pcStack_f8 = (code *)0x122363;
      switchToAssignment();
      return 3;
    }
LAB_00121d2a:
    lVar18 = lVar18 + 1;
  } while (lVar18 != 4);
  ppAStack_90 = (ArchTraits **)&(pBVar33->super_FuncPass).super_Pass._name;
  pBVar36 = (BaseRAPass *)0x0;
  pBStack_c0 = pBVar33;
  uStack_98 = uVar31;
  pWStack_88 = unaff_R15;
  pBVar45 = pBStack_f0;
  do {
    unaff_RBP = uStack_98;
    unaff_R12 = pBStack_c0;
    pBStack_e0 = pBVar36;
    if ((cStack_d4 == '\0') &&
       (uVar46 = (((RAAssignment *)&pBVar45->field_0x48)->_physToWorkMap->assigned)._masks._data
                 [(long)pBVar36], pBVar47 = pBVar36, uVar46 != 0)) {
      while( true ) {
        this = (RALocalAllocator *)(ulong)uVar46;
        pBVar35 = (BaseRAPass *)0xffffffff;
        uVar37 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
          }
        }
        unaff_R15 = (WorkToPhysMap *)(ulong)uVar37;
        uVar27 = (((RAAssignment *)&pBVar45->field_0x48)->_physToWorkIds)._data[(long)pBVar47]
                 [(long)unaff_R15];
        unaff_R13 = (BaseRAPass *)(ulong)uVar27;
        if (unaff_R13 == (BaseRAPass *)0xffffffff) goto LAB_00122359;
        if (*(uint *)(plStack_b8 + 1) <= uVar27) goto LAB_0012235e;
        if ((*(ulong *)(*plStack_b8 + (ulong)(uVar27 >> 6) * 8) >> ((ulong)unaff_R13 & 0x3f) & 1) !=
            0) break;
LAB_00121df3:
        pBVar38 = (BaseRAPass *)((ulong)pBVar47 & 0xff);
        pcStack_f8 = (code *)0x121e07;
        RAAssignment::unassign(pRStack_d0,(RegGroup)pBVar47,uVar27,uVar37);
        pBVar45 = pBStack_f0;
        pBVar36 = pBStack_e0;
LAB_00121e15:
        uVar46 = uVar46 - 1 & uVar46;
        pBVar47 = pBVar36;
        if (uVar46 == 0) goto LAB_00121e22;
      }
      if (uVar27 < (uint)unaff_RBP) {
        pBVar36 = pBVar47;
        if (pWStack_88[(long)unaff_R13].physIds[0] == 0xff) {
          if (((((RAAssignment *)&pBVar45->field_0x48)->_physToWorkMap->dirty)._masks._data
               [(long)pBVar47] >> (uVar37 & 0x1f) & 1) != 0) {
            pcStack_f8 = (code *)0x121de6;
            EVar14 = onSaveReg((RALocalAllocator *)pBVar45,(RegGroup)pBVar47,uVar27,uVar37);
            pBVar47 = pBStack_e0;
            if (EVar14 != 0) {
              return EVar14;
            }
          }
          goto LAB_00121df3;
        }
        goto LAB_00121e15;
      }
      pcStack_f8 = (code *)0x122370;
      switchToAssignment();
LAB_00122370:
      pcStack_f8 = (code *)0x122375;
      switchToAssignment();
LAB_00122375:
      pcStack_f8 = (code *)0x12237a;
      switchToAssignment();
LAB_0012237a:
      pcStack_f8 = (code *)0x12237f;
      switchToAssignment();
      break;
    }
LAB_00121e22:
    uVar46 = (((RARegMask *)&unaff_R12->_allocator)->_masks)._data
             [(long)(&pBVar36[-1].field_0x3b0 + 0xfa)];
    pBVar47 = pBVar36;
    if (uVar46 != 0) {
      puVar50 = (uint *)((long)ppAStack_90 + (long)pBVar36 * 4);
      iVar15 = -1;
      puStack_c8 = puVar50;
      pBVar38 = (BaseRAPass *)0x0;
      do {
        iVar15 = iVar15 + 1;
        if (iVar15 == 2) {
          if (cStack_d4 == '\0') {
            return 3;
          }
          break;
        }
        pBStack_b0 = pBVar38;
        puStack_a0 = apuStack_58[(long)pBVar36];
        unaff_R12 = (BaseRAPass *)(ulong)uVar46;
        do {
          uVar37 = 0;
          uVar27 = (uint)unaff_R12;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
            }
          }
          uVar34 = 1 << ((byte)uVar37 & 0x1f);
          uVar48 = *(uint *)((long)puStack_a0 + (ulong)(uVar37 * 4));
          unaff_R15 = (WorkToPhysMap *)(ulong)uVar48;
          if (unaff_R15 == (WorkToPhysMap *)0xffffffff) goto LAB_00122331;
          uVar49 = *(uint *)((long)(((RAAssignment *)&pBVar45->field_0x48)->_physToWorkIds)._data
                                   [(long)pBVar36] + (ulong)(uVar37 * 4));
          unaff_R13 = (BaseRAPass *)(ulong)uVar49;
          if (uVar49 == 0xffffffff) {
LAB_00121ff6:
            if ((((RAAssignment *)&pBVar45->field_0x48)->_layout).workCount <= uVar48)
            goto LAB_00122340;
            bVar25 = unaff_R15[(long)((RAAssignment *)&pBVar45->field_0x48)->_workToPhysMap].physIds
                     [0];
            unaff_R14 = (ulong)bVar25;
            if (bVar25 == 0xff) {
              if (*(uint *)(plStack_b8 + 1) <= uVar48) goto LAB_0012234f;
              uVar37 = uVar34;
              if ((*(ulong *)(*plStack_b8 + (ulong)(uVar48 >> 6) * 8) >> ((ulong)unaff_R15 & 0x3f) &
                  1) == 0) {
                uVar37 = 0;
              }
              pBStack_b0 = (BaseRAPass *)(ulong)((uint)pBStack_b0 | uVar37);
              uVar46 = uVar46 & ~uVar34;
            }
            else {
              if (uVar37 != bVar25) {
                unaff_R13 = (BaseRAPass *)(ulong)uVar46;
                pcStack_f8 = (code *)0x122034;
                RAAssignment::reassign(pRStack_d0,(RegGroup)pBVar36,uVar48,uVar37,(uint)bVar25);
                pBVar33 = (BaseRAPass *)(pBStack_f0->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_f8 = (code *)0x122049;
                EVar14 = (*(pBVar33->super_FuncPass).super_Pass._vptr_Pass[9])
                                   (pBVar33,(ulong)uVar48,(ulong)uVar37,(ulong)bVar25);
LAB_00122051:
                pBVar45 = pBStack_f0;
                pBVar36 = pBStack_e0;
                puVar50 = puStack_c8;
                if (EVar14 != 0) {
                  return EVar14;
                }
              }
LAB_00122067:
              uVar49 = *puVar50;
              pPVar21 = ((RAAssignment *)&pBVar45->field_0x48)->_physToWorkMap;
              uVar26 = (pPVar21->dirty)._masks._data[(long)pBVar36];
              if (((uVar26 ^ uVar49) & uVar34) != 0) {
                if ((uVar49 & uVar34) == 0) {
                  if ((uVar26 & uVar34) == 0) goto LAB_00122354;
                  puVar30 = puVar50;
                  if (cStack_a4 != '\0') {
                    unaff_R14 = (ulong)uVar46;
                    pcStack_f8 = (code *)0x122100;
                    EVar14 = onSaveReg((RALocalAllocator *)pBVar45,(RegGroup)pBVar36,uVar48,uVar37);
                    pBVar45 = pBStack_f0;
                    pBVar36 = pBStack_e0;
                    puVar50 = puStack_c8;
                    if (EVar14 != 0) {
                      return EVar14;
                    }
                    goto LAB_00122123;
                  }
                }
                else {
                  if ((uVar26 & uVar34) != 0) goto LAB_00122345;
                  puVar30 = (pPVar21->dirty)._masks._data + (long)pBVar36;
                  uVar49 = uVar26;
                }
                *puVar30 = uVar49 | uVar34;
              }
LAB_00122123:
              if (*(int *)((long)puStack_a0 + (ulong)(uVar37 << 2)) !=
                  *(int *)((long)(((RAAssignment *)&pBVar45->field_0x48)->_physToWorkIds)._data
                                 [(long)pBVar36] + (ulong)(uVar37 << 2))) goto LAB_00122336;
              if (((*puVar50 & uVar34) != 0) !=
                  (((((RAAssignment *)&pBVar45->field_0x48)->_physToWorkMap->dirty)._masks._data
                    [(long)pBVar36] & uVar34) != 0)) goto LAB_0012233b;
              uVar46 = uVar46 & ~uVar34;
              iVar15 = -1;
            }
          }
          else {
            if (uVar49 == uVar48) goto LAB_00122067;
            if (0 < iVar15) {
              if ((((RAAssignment *)&pBVar45->field_0x48)->_layout).workCount <= uVar48)
              goto LAB_0012234a;
              bVar25 = ((RAAssignment *)&pBVar45->field_0x48)->_workToPhysMap[(long)unaff_R15].
                       physIds[0];
              unaff_R14 = (ulong)bVar25;
              if (bVar25 != 0xff) {
                RVar13 = (RegGroup)pBVar36;
                if (((((ArchTraits *)(pBVar45->super_FuncPass).super_Pass._name)->_instHints)._data
                     [(long)pBVar36] & kRegSwap) == kNoHints) {
                  pPVar21 = ((RAAssignment *)&pBVar45->field_0x48)->_physToWorkMap;
                  if (((pPVar21->dirty)._masks._data[(long)pBVar36] & uVar34) == 0) {
                    pcStack_f8 = (code *)0x121fdb;
                    RAAssignment::unassign(pRStack_d0,RVar13,uVar49,uVar37);
                    pBVar45 = pBStack_f0;
                    pBVar36 = pBStack_e0;
                    puVar50 = puStack_c8;
                  }
                  else {
                    uVar16 = ~(pPVar21->assigned)._masks._data[(long)pBVar36] &
                             (((BaseRAPass *)(pBVar45->super_FuncPass).super_Pass._vptr_Pass)->
                             _availableRegs)._masks._data[(long)pBVar36];
                    uVar26 = ~(((RARegMask *)&pBStack_c0->_allocator)->_masks)._data
                              [(long)(&pBVar36[-1].field_0x3b0 + 0xfa)] & uVar16;
                    if ((uVar26 == 0) && (uVar26 = uVar16, uVar16 == 0)) {
                      uStack_a8 = (uint)pBVar36 & 0xff;
                      pcStack_f8 = (code *)0x12218d;
                      uStack_e4 = uVar46;
                      EVar14 = onSaveReg((RALocalAllocator *)pBVar45,RVar13,uVar49,uVar37);
                      if (EVar14 != 0) {
                        return EVar14;
                      }
                      pcStack_f8 = (code *)0x1221a8;
                      RAAssignment::unassign(pRStack_d0,(RegGroup)uStack_a8,uVar49,uVar37);
                      iVar15 = -1;
                      pBVar45 = pBStack_f0;
                      pBVar36 = pBStack_e0;
                      puVar50 = puStack_c8;
                      uVar46 = uStack_e4;
                      goto LAB_00121ff6;
                    }
                    uVar16 = 0;
                    if (uVar26 != 0) {
                      for (; (uVar26 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                      }
                    }
                    if (uVar16 != uVar37) {
                      pcStack_f8 = (code *)0x121f3a;
                      uStack_e4 = uVar46;
                      RAAssignment::reassign(pRStack_d0,RVar13,uVar49,uVar16,uVar37);
                      pBVar33 = (BaseRAPass *)(pBStack_f0->super_FuncPass).super_Pass._vptr_Pass;
                      pcStack_f8 = (code *)0x121f4f;
                      EVar14 = (*(pBVar33->super_FuncPass).super_Pass._vptr_Pass[9])
                                         (pBVar33,unaff_R13,(ulong)uVar16,(ulong)uVar37);
                      pBVar45 = pBStack_f0;
                      pBVar36 = pBStack_e0;
                      puVar50 = puStack_c8;
                      uVar46 = uStack_e4;
                      if (EVar14 != 0) {
                        return EVar14;
                      }
                    }
                    puVar30 = (((RARegMask *)&pBVar45->field_0x28)->_masks)._data + (long)pBVar36;
                    *puVar30 = *puVar30 | 1 << ((byte)uVar16 & 0x1f);
                  }
                  iVar15 = -1;
                  goto LAB_00121ff6;
                }
                pcStack_f8 = (code *)0x121f9e;
                uStack_e4 = uVar46;
                RAAssignment::swap(pRStack_d0,RVar13,uVar49,uVar37,uVar48,(uint)bVar25);
                pBVar33 = (BaseRAPass *)(pBStack_f0->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_f8 = (code *)0x121fb6;
                EVar14 = (*(pBVar33->super_FuncPass).super_Pass._vptr_Pass[10])
                                   (pBVar33,unaff_R13,(ulong)uVar37,unaff_R15,unaff_R14);
                uVar46 = uStack_e4;
                goto LAB_00122051;
              }
            }
          }
          uVar27 = uVar27 - 1 & uVar27;
          unaff_R12 = (BaseRAPass *)(ulong)uVar27;
        } while (uVar27 != 0);
        pBVar38 = pBStack_b0;
      } while (uVar46 != 0);
      pBVar47 = pBVar36;
      if ((int)pBVar38 != 0) {
        pPVar21 = ((RAAssignment *)&pBVar45->field_0x48)->_physToWorkMap;
        unaff_RBP = (ulong)pBVar36 & 0xff;
        do {
          pBVar35 = (BaseRAPass *)0xffffffff;
          uVar46 = 0;
          uVar37 = (uint)pBVar38;
          if (uVar37 != 0) {
            for (; (uVar37 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          unaff_R14 = (ulong)uVar46;
          uVar27 = 1 << ((byte)uVar46 & 0x1f);
          this = (RALocalAllocator *)(ulong)uVar27;
          if (((pPVar21->assigned)._masks._data[(long)pBVar47] >> (uVar46 & 0x1f) & 1) != 0) {
            if (cStack_d4 != '\0') goto LAB_001222ce;
            goto LAB_00122370;
          }
          uVar48 = apuStack_58[(long)pBVar47][unaff_R14];
          unaff_R15 = (WorkToPhysMap *)(ulong)uVar48;
          if (*(uint *)(plStack_b8 + 1) <= uVar48) goto LAB_00122375;
          if ((*(ulong *)(*plStack_b8 + (ulong)(uVar48 >> 6) * 8) >> ((ulong)unaff_R15 & 0x3f) & 1)
              == 0) goto LAB_0012237a;
          pcStack_f8 = (code *)0x12226d;
          RAAssignment::assign(pRStack_d0,(RegGroup)pBVar36,uVar48,uVar46,false);
          pBVar33 = (BaseRAPass *)(pBVar45->super_FuncPass).super_Pass._vptr_Pass;
          pcStack_f8 = (code *)0x12227d;
          EVar14 = (*(pBVar33->super_FuncPass).super_Pass._vptr_Pass[0xb])
                             (pBVar33,(ulong)uVar48,(ulong)uVar46);
          if (EVar14 != 0) {
            return EVar14;
          }
          pPVar21 = ((RAAssignment *)&pBVar45->field_0x48)->_physToWorkMap;
          uVar46 = (pPVar21->dirty)._masks._data[(long)pBStack_e0];
          unaff_R12 = pBVar45;
          pBVar47 = pBStack_e0;
          unaff_R13 = pBVar38;
          if ((*(uint *)((long)(&pBStack_c0->_formatOptions + -10) + (long)pBStack_e0 * 4) & uVar27)
              == 0) {
            pBVar35 = (BaseRAPass *)0xffffffff;
            if ((uVar46 & uVar27) != 0) goto LAB_0012237f;
          }
          else {
            (pPVar21->dirty)._masks._data[(long)pBStack_e0] = uVar46 | uVar27;
            pBVar35 = (BaseRAPass *)0xffffffff;
            if ((*(uint *)((long)(&pBStack_c0->_formatOptions + -10) + (long)pBStack_e0 * 4) &
                uVar27) == 0) goto LAB_0012237f;
          }
LAB_001222ce:
          uVar37 = uVar37 - 1 & uVar37;
          pBVar38 = (BaseRAPass *)(ulong)uVar37;
        } while (uVar37 != 0);
      }
    }
    pBVar36 = (BaseRAPass *)((long)&(pBVar47->super_FuncPass).super_Pass._vptr_Pass + 1);
    if (pBVar36 == (BaseRAPass *)0x4) {
      EVar14 = 0;
      if (cStack_d4 == '\0') {
        pcStack_f8 = (code *)0x12230b;
        bVar59 = RAAssignment::equals((RAAssignment *)&aStack_80,pRStack_d0);
        if (!bVar59) {
          pcStack_f8 = (code *)0x122314;
          switchToAssignment();
          EVar14 = extraout_EAX;
        }
      }
      return EVar14;
    }
  } while( true );
LAB_0012237f:
  pcStack_f8 = (code *)0x122384;
  switchToAssignment();
LAB_00122384:
  uVar37 = (uint)pBVar38;
  pcStack_f8 = (code *)0x122389;
  switchToAssignment();
LAB_00122389:
  pcStack_f8 = spillScratchGpRegsBeforeEntry;
  switchToAssignment();
  if (uVar37 == 0) {
    return 0;
  }
  this_00 = (RAAssignment *)&pBVar35->field_0x48;
  pBVar33 = pBVar35;
  pRStack_118 = this;
  pBStack_110 = unaff_R12;
  uStack_108 = unaff_R14;
  pWStack_100 = unaff_R15;
  pcStack_f8 = (code *)unaff_RBP;
  do {
    uVar46 = 0;
    if (uVar37 != 0) {
      for (; (uVar37 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
      }
    }
    pBVar36 = (BaseRAPass *)(ulong)uVar46;
    pPVar21 = ((RAAssignment *)&pBVar35->field_0x48)->_physToWorkMap;
    uVar27 = 1 << ((byte)uVar46 & 0x1f);
    if (((pPVar21->assigned)._masks._data[0] >> (uVar46 & 0x1f) & 1) != 0) {
      pIVar39 = (InstNode *)(ulong)uVar46;
      uVar48 = (((RAAssignment *)&pBVar35->field_0x48)->_physToWorkIds)._data[0][(long)pIVar39];
      pBVar38 = (BaseRAPass *)(ulong)uVar48;
      uVar34 = (pPVar21->dirty)._masks._data[0];
      if ((uVar34 & uVar27) != 0) {
        if (uVar48 == 0xffffffff) {
          pBStack_120 = (BaseRAPass *)0x12242e;
          spillScratchGpRegsBeforeEntry();
LAB_0012242e:
          pBStack_120 = (BaseRAPass *)0x122433;
          spillScratchGpRegsBeforeEntry();
        }
        else {
          if ((((RAAssignment *)&pBVar35->field_0x48)->_layout).workCount <= uVar48)
          goto LAB_0012242e;
          bVar25 = ((WorkToPhysMap *)
                   ((long)&(pBVar38->super_FuncPass).super_Pass._vptr_Pass +
                   (long)((RAAssignment *)&pBVar35->field_0x48)->_workToPhysMap))->physIds[0];
          pIVar39 = (InstNode *)(ulong)bVar25;
          if (uVar46 == bVar25) {
            (pPVar21->dirty)._masks._data[0] = uVar34 & ~uVar27;
            pBVar33 = (BaseRAPass *)(pBVar35->super_FuncPass).super_Pass._vptr_Pass;
            pBStack_120 = (BaseRAPass *)0x1223ff;
            EVar14 = (*(pBVar33->super_FuncPass).super_Pass._vptr_Pass[0xc])
                               (pBVar33,pBVar38,(ulong)uVar46);
            if (EVar14 != 0) {
              return EVar14;
            }
            goto LAB_00122403;
          }
        }
        pBStack_120 = (BaseRAPass *)allocInst;
        spillScratchGpRegsBeforeEntry();
        pBStack_120 = pBVar36;
        pRStack_128 = this_00;
        uStack_130 = (ulong)uVar37;
        pBStack_138 = unaff_R13;
        pBStack_140 = pBVar38;
        pBStack_148 = pBVar35;
        pBVar32 = *(BaseRAPass **)(pIVar39 + 0x20);
        (((BaseCompiler *)(pBVar33->super_FuncPass).super_Pass._cb)->super_BaseBuilder)._cursor =
             *(BaseNode **)pIVar39;
        *(InstNode **)&pBVar33->_instructionCount = pIVar39;
        *(BaseRAPass **)&pBVar33->_sharedAssignments = pBVar32;
        *(uint32_t *)&pBVar33->field_0xf0 = *(uint32_t *)&(pBVar32->super_FuncPass).super_Pass._name
        ;
        ((RARegCount *)&pBVar33->field_0xf4)->field_0 =
             (anon_union_4_2_ebeb14a8_for_RARegCount_0)
             (((RARegMask *)&pBVar32->_allocator)->_masks)._data[0];
        pBStack_3f8 = (BaseRAPass *)&pBVar33->field_0x48;
        auStack_390._56_8_ = pIVar39 + 0x40;
        pBVar57 = (BaseRAPass *)0x0;
        uStack_398 = 0;
        pBStack_430 = pBVar33;
        pIStack_3b0 = pIVar39;
        pBStack_3a0 = pBVar32;
        break;
      }
LAB_00122403:
      pBStack_120 = (BaseRAPass *)0x122412;
      pBVar33 = (BaseRAPass *)this_00;
      RAAssignment::unassign(this_00,k0,uVar48,uVar46);
    }
    uVar37 = uVar37 - 1 & uVar37;
    if (uVar37 == 0) {
      return 0;
    }
  } while( true );
LAB_001224bb:
  bVar25 = (char)pBVar57 * '\b';
  pBVar41 = *(BaseRAPass **)&pBVar33->_sharedAssignments;
  uVar46 = *(uint *)((long)&(pBVar41->super_FuncPass).super_Pass._name + 4) >> (bVar25 & 0x1f);
  pBVar22 = (BaseRAPass *)(ulong)uVar46;
  uStack_41c = (((RARegMask *)&pBVar41->field_0x28)->_masks)._data
               [(long)((long)&(pBVar57->super_FuncPass).super_Pass._vptr_Pass + 1)];
  uStack_3ec = (((RARegMask *)&pBVar41->field_0x38)->_masks)._data
               [(long)((long)&(pBVar57->super_FuncPass).super_Pass._vptr_Pass + 1)];
  pBVar29 = (BaseRAPass *)(ulong)uStack_3ec;
  cStack_40d = '\x01';
  uVar37 = (((RARegCount *)&pBVar33->field_0xf4)->field_0)._packed >> (bVar25 & 0x1f) & 0xff;
  pBVar55 = (BaseRAPass *)(ulong)uVar37;
  pBVar53 = pBVar33;
  pBStack_428 = pBVar57;
  if (uVar37 == 0) {
    pBStack_3e0 = (BaseRAPass *)0x0;
    uStack_3bc = 0;
    pBStack_3d8 = (BaseRAPass *)0x0;
    uStack_40c = 0;
    pBVar56 = (BaseRAPass *)(ulong)uStack_3ec;
    cVar60 = cStack_40d;
LAB_00123209:
    cStack_40d = cVar60;
    uVar46 = (uint)pBVar56;
    pBVar28 = pBVar29;
    pBVar42 = pBVar41;
    pBVar55 = pBVar56;
    while (uVar46 != 0) {
      uVar37 = 0;
      uVar46 = (uint)pBVar55;
      if (uVar46 != 0) {
        for (; (uVar46 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
        }
      }
      pBVar35 = (BaseRAPass *)(ulong)uVar37;
      uVar27 = (((RAAssignment *)&pBVar53->field_0x48)->_physToWorkIds)._data[(long)pBVar57]
               [(long)pBVar35];
      pBVar36 = (BaseRAPass *)(ulong)uVar27;
      if (uVar27 != 0xffffffff) {
        if (((((RAAssignment *)&pBVar53->field_0x48)->_physToWorkMap->dirty)._masks._data
             [(long)pBVar57] >> (uVar37 & 0x1f) & 1) != 0) {
          pcStack_438 = (code *)0x12323d;
          EVar14 = onSaveReg((RALocalAllocator *)pBVar53,(RegGroup)pBVar57,uVar27,uVar37);
          if (EVar14 != 0) {
            return EVar14;
          }
        }
        pBVar42 = (BaseRAPass *)((ulong)pBVar57 & 0xff);
        pcStack_438 = (code *)0x123257;
        pBVar28 = pBVar35;
        pBVar22 = pBStack_3f8;
        RAAssignment::unassign((RAAssignment *)pBStack_3f8,(RegGroup)pBVar57,uVar27,uVar37);
        pBVar32 = extraout_RDX_01;
      }
      uVar46 = uVar46 - 1 & uVar46;
      pBVar55 = (BaseRAPass *)(ulong)uVar46;
    }
    if (uStack_3bc != 0) {
      pBVar55 = (BaseRAPass *)(ulong)uStack_3bc;
      pBVar33 = (BaseRAPass *)0x0;
      do {
        puVar50 = (uint *)auStack_250[(long)pBVar33];
        pBVar38 = (BaseRAPass *)(ulong)puVar50[4];
        if (puVar50[4] != 0) {
          uVar46 = *puVar50;
          pBVar35 = (BaseRAPass *)(ulong)uVar46;
          bVar25 = *(byte *)((long)puVar50 + 0xe);
          pBVar36 = (BaseRAPass *)(ulong)bVar25;
          do {
            uVar37 = 0;
            uVar27 = (uint)pBVar38;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
              }
            }
            pBVar32 = (BaseRAPass *)(ulong)uVar37;
            if (uVar37 != bVar25) {
              pBVar22 = *(BaseRAPass **)&pBVar53->super_FuncPass;
              pBVar42 = (BaseRAPass *)(ulong)uVar46;
              pBVar28 = (BaseRAPass *)(ulong)(uint)bVar25;
              pcStack_438 = (code *)0x12329e;
              (**(code **)&((BaseRAPass *)(pBVar22->super_FuncPass).super_Pass._vptr_Pass)->
                           field_0x48)();
              pBVar32 = extraout_RDX_02;
            }
            uVar27 = uVar27 - 1 & uVar27;
            pBVar38 = (BaseRAPass *)(ulong)uVar27;
          } while (uVar27 != 0);
        }
        pBVar33 = (BaseRAPass *)((long)&(pBVar33->super_FuncPass).super_Pass._vptr_Pass + 1);
      } while (pBVar33 != pBVar55);
    }
    if (((pBStack_428 == (BaseRAPass *)0x1) && (pIStack_3b0[0x10] == (InstNode)0x12)) &&
       (uVar46 = *(uint *)(*(long *)(&pBVar53->field_0x48 + 0x20) + 4) &
                 *(uint *)(pIStack_3b0 + 0xa8), pBVar55 = (BaseRAPass *)(ulong)uVar46, uVar46 != 0))
    {
      IVar5 = pIStack_3b0[0x8d];
      pBVar36 = (BaseRAPass *)(ulong)(byte)IVar5;
      while( true ) {
        uVar46 = 0;
        uVar37 = (uint)pBVar55;
        if (uVar37 != 0) {
          for (; (uVar37 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
          }
        }
        pBVar35 = (BaseRAPass *)(ulong)uVar46;
        pp_Var51 = (pBVar53->super_FuncPass).super_Pass._vptr_Pass;
        pBVar28 = *(BaseRAPass **)(&pBVar53->field_0x48 + 0x30);
        uVar27 = (((RARegMask *)&pBVar28->_allocator)->_masks)._data
                 [(long)(&pBVar35[-1].field_0x3b0 + 0xfa)];
        pBVar57 = (BaseRAPass *)(ulong)uVar27;
        pBVar43 = pBVar42;
        if (*(uint *)(pp_Var51 + 0x29) <= uVar27) break;
        if ((uint)(byte)IVar5 <
            *(uint *)(*(long *)(*(long *)(pp_Var51[0x28] + (long)pBVar57 * 8) + 8) + 8)) {
          if ((*(uint *)(*(long *)(&pBVar53->field_0x48 + 0x20) + 0x14) >> (uVar46 & 0x1f) & 1) != 0
             ) {
            pcStack_438 = (code *)0x12334c;
            EVar14 = onSaveReg((RALocalAllocator *)pBVar53,kVec,uVar27,uVar46);
            if (EVar14 != 0) {
              return EVar14;
            }
          }
          pBVar42 = (BaseRAPass *)0x1;
          pcStack_438 = (code *)0x123368;
          pBVar28 = pBVar35;
          pBVar22 = pBStack_3f8;
          RAAssignment::unassign((RAAssignment *)pBStack_3f8,kVec,uVar27,uVar46);
          pBVar32 = extraout_RDX_03;
        }
        uVar37 = uVar37 - 1 & uVar37;
        pBVar55 = (BaseRAPass *)(ulong)uVar37;
        if (uVar37 == 0) goto LAB_00123374;
      }
LAB_001236fd:
      pcStack_438 = (code *)0x123702;
      allocInst();
LAB_00123702:
      pcStack_438 = (code *)0x123707;
      allocInst();
LAB_00123707:
      pcStack_438 = (code *)0x12370c;
      allocInst();
      pBVar40 = pBVar43;
      pBVar33 = pBVar53;
LAB_0012370c:
      pcStack_438 = (code *)0x123711;
      allocInst();
LAB_00123711:
      pcStack_438 = (code *)0x123716;
      allocInst();
LAB_00123716:
      pcStack_438 = (code *)0x12371b;
      allocInst();
      pBVar53 = pBVar33;
LAB_0012371b:
      pcStack_438 = (code *)0x123720;
      allocInst();
      pBVar43 = pBVar40;
      goto LAB_00123720;
    }
LAB_00123374:
    uStack_3ec = uStack_3ec | uStack_41c;
    if (uStack_40c != 0) {
      pBStack_408 = (BaseRAPass *)
                    CONCAT44(pBStack_408._4_4_,
                             *(undefined4 *)
                              (*(long *)(&pBVar53->field_0x48 + 0x20) + (long)pBStack_428 * 4));
      if (((int)pBStack_3d8 != 0) &&
         (((ulong)(((FuncPass *)auStack_390._16_8_)->super_Pass)._cb & 0x800) != 0)) {
        uVar46 = *(uint *)((long)&(((FuncPass *)auStack_390._16_8_)->super_Pass)._name + 4);
        if (uVar46 == 0) {
          return 0x3d;
        }
        pZVar12 = &pBVar53->_allocator;
        pp_Var51 = (pBVar53->super_FuncPass).super_Pass._vptr_Pass;
        pBVar28 = (BaseRAPass *)((ulong)pBStack_3d8 & 0xffffffff);
        pBVar53 = (BaseRAPass *)(ulong)(uint)((int)pBStack_3d8 << 3);
        pBVar47 = (BaseRAPass *)0x0;
        pBVar45 = (BaseRAPass *)0xffffffff;
        uVar37 = uVar46;
        do {
          uVar27 = 0;
          if (uVar37 != 0) {
            for (; (uVar37 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
            }
          }
          if ((uVar46 >> (uVar27 & 0x1f) & 1) != 0) {
            pBVar55 = (BaseRAPass *)(ulong)uVar27;
            pBVar35 = (BaseRAPass *)0xf;
            lVar18 = 0;
            do {
              if ((*(uint *)(pZVar12 + (long)pBStack_428 * 4) >> ((uint)pBVar55 & 0x1f) & 1) == 0) {
                pBVar35 = (BaseRAPass *)0x0;
                break;
              }
              if (*(uint *)(pp_Var51 + 0x29) <= **(uint **)(auStack_390 + lVar18 + 0x10)) {
LAB_00123696:
                pcStack_438 = (code *)0x12369b;
                allocInst();
                return 0x3d;
              }
              pBVar38 = (BaseRAPass *)
                        (ulong)*(byte *)(*(long *)(pp_Var51[0x28] +
                                                  (ulong)**(uint **)(auStack_390 + lVar18 + 0x10) *
                                                  8) + 0x4a);
              pBVar36 = (BaseRAPass *)(ulong)(pBVar55 == pBVar38);
              pBVar35 = (BaseRAPass *)(ulong)((int)pBVar35 + (uint)(pBVar55 == pBVar38));
              lVar18 = lVar18 + 8;
              pBVar55 = (BaseRAPass *)((long)&(pBVar55->super_FuncPass).super_Pass._vptr_Pass + 1);
            } while (pBVar53 != (BaseRAPass *)lVar18);
            if ((uint)pBVar47 < (uint)pBVar35) {
              pBVar45 = (BaseRAPass *)(ulong)uVar27;
              pBVar47 = pBVar35;
            }
          }
          uVar37 = uVar37 - 1 & uVar37;
        } while (uVar37 != 0);
        if ((int)pBVar45 == -1) {
          return 0x3d;
        }
        pBVar32 = (BaseRAPass *)0x0;
        do {
          pBVar42 = (BaseRAPass *)alStack_350[(long)&pBVar32[-1].field_0x4aa];
          uVar46 = (int)pBVar45 + (int)pBVar32;
          pBVar22 = (BaseRAPass *)(ulong)uVar46;
          *(char *)((long)&(pBVar42->super_FuncPass).super_Pass._cb + 7) = (char)uVar46;
          pBVar32 = (BaseRAPass *)((long)&(pBVar32->super_FuncPass).super_Pass._vptr_Pass + 1);
        } while (pBVar28 != pBVar32);
      }
      pBVar43 = pBVar42;
      pBVar57 = pBStack_428;
      if (cStack_40d == '\0') {
        pBVar38 = (BaseRAPass *)0x0;
        pBStack_418 = (BaseRAPass *)((ulong)pBStack_418 & 0xffffffff00000000);
        pBVar55 = pBStack_428;
        do {
          pBVar53 = (BaseRAPass *)alStack_350[(long)pBVar38];
          uVar46 = *(uint *)&(pBVar53->super_FuncPass).super_Pass._cb;
          pBVar56 = (BaseRAPass *)(ulong)uVar46;
          pBVar57 = pBVar55;
          if ((uVar46 & 8) != 0) {
            uVar37 = *(uint *)&(pBVar53->super_FuncPass).super_Pass._vptr_Pass;
            pBVar35 = (BaseRAPass *)(ulong)uVar37;
            pBVar29 = pBVar28;
            pBVar41 = pBVar42;
            if (pBVar35 == (BaseRAPass *)0xffffffff) goto LAB_001236df;
            if ((((RAAssignment *)&pBStack_430->field_0x48)->_layout).workCount <= uVar37)
            goto LAB_001236e4;
            bVar25 = ((WorkToPhysMap *)
                     ((long)&(pBVar35->super_FuncPass).super_Pass._vptr_Pass +
                     (long)((RAAssignment *)&pBStack_430->field_0x48)->_workToPhysMap))->physIds[0];
            pBVar29 = (BaseRAPass *)(ulong)bVar25;
            RVar13 = (RegGroup)pBVar55;
            if (bVar25 != 0xff) {
              pBVar42 = (BaseRAPass *)((ulong)pBVar55 & 0xff);
              pcStack_438 = (code *)0x123503;
              pBVar22 = pBStack_3f8;
              RAAssignment::unassign((RAAssignment *)pBStack_3f8,RVar13,uVar37,(uint)bVar25);
              pBVar32 = extraout_RDX_04;
            }
            pBVar57 = pBStack_430;
            bVar25 = *(undefined1 *)((long)&(pBVar53->super_FuncPass).super_Pass._cb + 7);
            pBVar36 = (BaseRAPass *)(ulong)bVar25;
            pBVar28 = pBVar36;
            if (bVar25 != 0xff) {
LAB_00123549:
              pBVar57 = pBVar55;
              if (0x1f < (uint)pBVar28) goto LAB_001236ee;
              bVar25 = (byte)pBVar28;
              pBVar36 = pBVar28;
LAB_0012355d:
              uVar46 = 1 << (bVar25 & 0x1f);
              pBVar56 = (BaseRAPass *)(ulong)uVar46;
              pBVar29 = pBVar28;
              if (((((RAAssignment *)&pBStack_430->field_0x48)->_physToWorkMap->assigned)._masks.
                   _data[(long)pBVar57] & uVar46) != 0) goto LAB_001236e9;
              uVar27 = *(uint *)&(pBVar53->super_FuncPass).super_Pass._cb;
              if ((uVar27 >> 0x12 & 1) == 0) {
                pBVar42 = (BaseRAPass *)((ulong)pBVar57 & 0xff);
                pBVar45 = (BaseRAPass *)0x1;
                pcStack_438 = (code *)0x123591;
                pBVar28 = pBVar36;
                pBVar22 = pBStack_3f8;
                RAAssignment::assign
                          ((RAAssignment *)pBStack_3f8,(RegGroup)pBVar57,uVar37,(uint32_t)pBVar36,
                           true);
                uVar27 = *(uint *)&(pBVar53->super_FuncPass).super_Pass._cb;
                pBVar32 = extraout_RDX_06;
              }
              *(char *)((long)&(pBVar53->super_FuncPass).super_Pass._cb + 7) = (char)pBVar36;
              *(uint *)&(pBVar53->super_FuncPass).super_Pass._cb = uVar27 | 0x200;
              pBStack_418 = (BaseRAPass *)CONCAT44(pBStack_418._4_4_,(uint)pBStack_418 | uVar46);
              pBVar56 = (BaseRAPass *)(ulong)~uVar46;
              pBStack_408 = (BaseRAPass *)CONCAT44(pBStack_408._4_4_,(uint)pBStack_408 & ~uVar46);
              uStack_40c = uStack_40c - 1;
              goto LAB_001235b8;
            }
            uVar46 = ~((int)(short)uVar46 >> 0xf & uStack_41c | (uint)pBStack_418) &
                     *(uint *)((long)&(pBVar53->super_FuncPass).super_Pass._name + 4);
            pBVar29 = (BaseRAPass *)(ulong)uVar46;
            uVar27 = ~(uint)pBStack_408 & uVar46;
            pBVar45 = (BaseRAPass *)(ulong)uVar27;
            pBVar22 = pBStack_430;
            if (uVar27 != 0) {
              pBVar42 = (BaseRAPass *)((ulong)pBVar55 & 0xff);
              pcStack_438 = (code *)0x123547;
              uVar17 = decideOnAssignment((RALocalAllocator *)pBStack_430,RVar13,uVar37,uVar46,
                                          uVar27);
              pBVar28 = (BaseRAPass *)(ulong)uVar17;
              pBVar32 = extraout_RDX_05;
              goto LAB_00123549;
            }
            pBVar28 = (BaseRAPass *)(ulong)(uVar46 & (uint)pBStack_408);
            pBVar40 = (BaseRAPass *)((ulong)pBVar55 & 0xff);
            uStack_420 = (uint)pBVar40;
            pBVar45 = (BaseRAPass *)auStack_390;
            pcStack_438 = (code *)0x1235ec;
            uVar17 = decideOnSpillFor((RALocalAllocator *)pBStack_430,RVar13,(uint32_t)pBVar32,
                                      uVar46 & (uint)pBStack_408,(uint32_t *)pBVar45);
            workId = auStack_390._0_4_;
            if (uVar17 < 0x20) {
              pBVar36 = (BaseRAPass *)(ulong)uVar17;
              bVar25 = (byte)uVar17;
              if ((*(uint *)(*(long *)(&pBVar57->field_0x48 + 0x20) + 0x10 + (long)pBVar55 * 4) >>
                   (uVar17 & 0x1f) & 1) != 0) {
                pcStack_438 = (code *)0x12362c;
                EVar14 = onSaveReg((RALocalAllocator *)pBVar57,(RegGroup)uStack_420,
                                   auStack_390._0_4_,uVar17);
                if (EVar14 != 0) {
                  return EVar14;
                }
              }
              pBVar42 = (BaseRAPass *)(ulong)uStack_420;
              pBVar28 = (BaseRAPass *)(ulong)uVar17;
              pcStack_438 = (code *)0x123643;
              pBVar22 = pBStack_3f8;
              RAAssignment::unassign((RAAssignment *)pBStack_3f8,(RegGroup)uStack_420,workId,uVar17)
              ;
              pBVar32 = extraout_RDX_07;
              pBVar57 = pBStack_428;
              goto LAB_0012355d;
            }
            goto LAB_0012371b;
          }
LAB_001235b8:
          pBVar38 = (BaseRAPass *)((long)&(pBVar38->super_FuncPass).super_Pass._vptr_Pass + 1);
          pBVar55 = pBVar57;
        } while (pBStack_3e0 != pBVar38);
        pBVar43 = pBVar42;
        pBVar53 = pBStack_430;
        pBVar55 = pBVar56;
        if (uStack_40c == 0) {
          uStack_3ec = uStack_3ec | (uint)pBStack_418;
          pBStack_428 = pBVar57;
          goto LAB_00123674;
        }
      }
      goto LAB_00123725;
    }
LAB_00123674:
    puVar50 = (((RARegMask *)&pBVar53->field_0x28)->_masks)._data + (long)pBStack_428;
    *puVar50 = *puVar50 | uStack_3ec;
    pBVar57 = (BaseRAPass *)((long)&(pBStack_428->super_FuncPass).super_Pass._vptr_Pass + 1);
    pBVar33 = pBVar53;
    if (pBVar57 == (BaseRAPass *)0x4) {
      return 0;
    }
    goto LAB_001224bb;
  }
  uVar46 = uVar46 & 0xff;
  uStack_3a8 = (ulong)uVar46;
  pBVar43 = (BaseRAPass *)
            ((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
            ((ulong)(uVar46 << 5) - 0x24));
  pBStack_3e0 = (BaseRAPass *)(ulong)uVar37;
  pBStack_418 = (BaseRAPass *)0x0;
  uStack_40c = 0;
  uVar27 = 0;
  pBVar28 = pBVar29;
  pBVar40 = pBStack_3e0;
  pBVar42 = pBVar43;
  uVar31 = 0;
  do {
    uVar48 = *(uint *)&(pBVar42->super_FuncPass).super_Pass._cb;
    pBVar45 = (BaseRAPass *)(ulong)uVar48;
    if ((uVar48 & 0x1c00) != 0) {
      uVar34 = uVar48 >> 0xd & 3;
      if ((uVar48 >> 0xc & 1) != 0) {
        uVar34 = 0;
      }
      pBVar28 = (BaseRAPass *)(ulong)uVar34;
      if ((uVar27 >> uVar34 & 1) != 0) {
        return 3;
      }
      uVar27 = uVar27 | 1 << (sbyte)uVar34;
      alStack_350[(ulong)uVar34 - 6] = (long)pBVar42;
    }
    pBVar29 = (BaseRAPass *)auStack_390._16_8_;
    if ((uVar48 & 0x40008) != 0) {
      uVar19 = (ulong)uStack_40c;
      uStack_40c = uStack_40c + 1;
      pBVar28 = (BaseRAPass *)(ulong)uStack_40c;
      alStack_350[uVar19] = (long)pBVar42;
    }
    uVar19 = uVar31;
    if ((uVar48 >> 0x10 & 1) != 0) {
      uVar19 = (ulong)((int)uVar31 + 1);
      auStack_250[uVar31] = pBVar42;
    }
    uStack_420 = uVar37;
    pBStack_408 = pBVar43;
    pBStack_3b8 = pBVar41;
    if ((uVar48 & 4) != 0) {
      if ((uVar48 >> 10 & 1) != 0) goto LAB_001226a6;
      uVar34 = *(uint *)&(pBVar42->super_FuncPass).super_Pass._vptr_Pass;
      pBVar28 = (BaseRAPass *)0xffffffff;
      if ((ulong)uVar34 == 0xffffffff) {
LAB_001236cb:
        pcStack_438 = (code *)0x1236d0;
        allocInst();
        pBVar22 = pBVar42;
        pBVar53 = pBVar33;
        pBVar56 = pBVar55;
LAB_001236d0:
        pBVar55 = pBVar57;
        pBVar41 = pBVar40;
        pBVar29 = pBVar28;
        pcStack_438 = (code *)0x1236d5;
        allocInst();
LAB_001236d5:
        pcStack_438 = (code *)0x1236da;
        allocInst();
LAB_001236da:
        pcStack_438 = (code *)0x1236df;
        allocInst();
LAB_001236df:
        pcStack_438 = (code *)0x1236e4;
        allocInst();
        pBVar42 = pBVar41;
        pBVar57 = pBVar55;
LAB_001236e4:
        pcStack_438 = (code *)0x1236e9;
        allocInst();
LAB_001236e9:
        pBVar28 = pBVar36;
        pcStack_438 = (code *)0x1236ee;
        allocInst();
LAB_001236ee:
        pcStack_438 = (code *)0x1236f3;
        allocInst();
LAB_001236f3:
        pcStack_438 = (code *)0x1236f8;
        allocInst();
        pBVar36 = pBVar28;
        pBVar55 = pBVar56;
LAB_001236f8:
        pcStack_438 = (code *)0x1236fd;
        allocInst();
        pBVar28 = pBVar29;
        pBVar43 = pBVar42;
        goto LAB_001236fd;
      }
      pBVar22 = pBVar42;
      pBVar56 = pBVar55;
      if ((((RAAssignment *)&pBVar33->field_0x48)->_layout).workCount <= uVar34) goto LAB_001236d0;
      bVar25 = ((RAAssignment *)&pBVar33->field_0x48)->_workToPhysMap[uVar34].physIds[0];
      bVar2 = *(undefined1 *)((long)&(pBVar42->super_FuncPass).super_Pass._cb + 6);
      pBVar28 = (BaseRAPass *)(ulong)bVar2;
      if (bVar2 == 0xff) {
        if (bVar25 != 0xff) {
          uVar49 = 1 << (bVar25 & 0x1f);
          pBVar47 = (BaseRAPass *)(ulong)uVar49;
          uVar34 = ~uStack_41c & *(uint *)&(pBVar42->super_FuncPass).super_Pass._name;
          pBVar28 = (BaseRAPass *)(ulong)uVar34;
          if ((uVar34 >> (bVar25 & 0x1f) & 1) != 0) {
            *(byte *)((long)&(pBVar42->super_FuncPass).super_Pass._cb + 6) = bVar25;
            *(uint *)&(pBVar42->super_FuncPass).super_Pass._cb = uVar48 | 0x100;
            if ((uVar48 & 2) != 0) {
              puVar50 = (((RAAssignment *)&pBVar33->field_0x48)->_physToWorkMap->dirty)._masks._data
                        + (long)pBVar57;
              *puVar50 = *puVar50 | uVar49;
            }
            goto LAB_00122687;
          }
LAB_00122699:
          pBStack_418 = (BaseRAPass *)(ulong)((uint)pBStack_418 | (uint)pBVar47);
        }
        goto LAB_001226a6;
      }
      uVar49 = 1 << (bVar2 & 0x1f);
      pBVar47 = (BaseRAPass *)(ulong)uVar49;
      if ((uStack_41c >> (bVar2 & 0x1f) & 1) != 0) {
        if (bVar25 != bVar2) {
          pBVar47 = (BaseRAPass *)
                    (ulong)(uVar49 & (((RAAssignment *)&pBVar33->field_0x48)->_physToWorkMap->
                                     assigned)._masks._data[(long)pBVar57]);
          goto LAB_00122699;
        }
        *(uint *)&(pBVar42->super_FuncPass).super_Pass._cb = uVar48 | 0x100;
        pBVar28 = (BaseRAPass *)(ulong)(uVar48 | 0x100);
        if ((uVar48 & 2) != 0) {
          uVar48 = 1 << (bVar25 & 0x1f);
          pBVar45 = (BaseRAPass *)(ulong)uVar48;
          puVar50 = (((RAAssignment *)&pBVar33->field_0x48)->_physToWorkMap->dirty)._masks._data +
                    (long)pBVar57;
          *puVar50 = *puVar50 | uVar48;
          pBVar28 = (BaseRAPass *)(ulong)CONCAT31((int3)(uVar34 >> 8),bVar25);
        }
LAB_00122687:
        pBVar55 = (BaseRAPass *)(ulong)((int)pBVar55 - 1);
        uStack_41c = uStack_41c | (uint)pBVar47;
        goto LAB_001226a6;
      }
      goto LAB_0012370c;
    }
    pBVar45 = (BaseRAPass *)(ulong)(uVar48 | 0x100);
    *(uint *)&(pBVar42->super_FuncPass).super_Pass._cb = uVar48 | 0x100;
    pBVar55 = (BaseRAPass *)(ulong)((int)pBVar55 - 1);
LAB_001226a6:
    pBVar42 = (BaseRAPass *)&pBVar42->field_0x20;
    pBVar40 = (BaseRAPass *)(&pBVar40[-1].field_0x3b0 + 0xff);
    uVar31 = uVar19;
  } while (pBVar40 != (BaseRAPass *)0x0);
  uStack_3bc = (uint)uVar19;
  pBVar32 = pBStack_418;
  if (uVar27 != 0) {
    if ((uVar27 + 1 & uVar27) != 0) {
      return 3;
    }
    uVar48 = 0;
    if (~uVar27 != 0) {
      for (; (~uVar27 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
      }
    }
    pBStack_3d8 = (BaseRAPass *)(ulong)uVar48;
    if (((ulong)(((FuncPass *)auStack_390._16_8_)->super_Pass)._cb & 0x400) == 0) goto LAB_00122909;
    uVar27 = (((RARegMask *)&pBVar33->_allocator)->_masks)._data[(long)pBVar57];
    if (uVar48 != 0) {
      uVar34 = (((RAAssignment *)&pBVar33->field_0x48)->_layout).workCount;
      pBVar42 = (BaseRAPass *)(ulong)uVar34;
      pBVar22 = (BaseRAPass *)((RAAssignment *)&pBVar33->field_0x48)->_workToPhysMap;
      pBVar45 = (BaseRAPass *)0x0;
      while( true ) {
        pBVar47 = (BaseRAPass *)(ulong)*(uint *)alStack_350[(long)&pBVar45[-1].field_0x4aa];
        pBVar28 = pBVar36;
        pBVar56 = pBVar55;
        if (pBVar47 == (BaseRAPass *)0xffffffff) goto LAB_001236f3;
        if (uVar34 <= *(uint *)alStack_350[(long)&pBVar45[-1].field_0x4aa]) break;
        *(uint *)(auStack_390 + (long)pBVar45 * 4) =
             (uint)(byte)*(BaseNode *)
                          ((long)&pBVar22[1].super_FuncPass.super_Pass._vptr_Pass +
                          (long)(pBVar47 + -1));
        pBVar45 = (BaseRAPass *)((long)&(pBVar45->super_FuncPass).super_Pass._vptr_Pass + 1);
        if (pBStack_3d8 == pBVar45) goto LAB_0012273d;
      }
      goto LAB_001236f8;
    }
LAB_0012273d:
    uVar34 = *(uint *)&(pBVar29->super_FuncPass).super_Pass._name;
    if (uVar34 == 0) {
      return 0x3d;
    }
    pBVar22 = (BaseRAPass *)(pBVar33->super_FuncPass).super_Pass._vptr_Pass;
    pBVar45 = (BaseRAPass *)(ulong)(uVar48 * 4);
    pBVar28 = (BaseRAPass *)0xffffffff;
    pBVar47 = (BaseRAPass *)0x0;
    uVar49 = uVar34;
    do {
      uVar26 = 0;
      if (uVar49 != 0) {
        for (; (uVar49 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
        }
      }
      pBStack_400 = pBStack_3d8;
      if ((uVar34 >> (uVar26 & 0x1f) & 1) != 0) {
        if (uVar48 == 0) {
          pBVar35 = (BaseRAPass *)0xf;
        }
        else {
          pBVar29 = (BaseRAPass *)(ulong)uVar26;
          pBVar35 = (BaseRAPass *)0xf;
          pBVar53 = (BaseRAPass *)0x0;
          do {
            if ((((uVar27 | (uint)pBStack_418) & ~uStack_41c) >> ((uint)pBVar29 & 0x1f) & 1) == 0) {
              pBVar35 = (BaseRAPass *)0x0;
              break;
            }
            if (*(uint *)&pBVar22->field_0x148 <=
                **(uint **)(auStack_390 + (long)pBVar53 * 2 + 0x10)) {
              pcStack_438 = (code *)0x123696;
              allocInst();
              goto LAB_00123696;
            }
            bVar59 = pBVar29 ==
                     (BaseRAPass *)
                     (ulong)*(byte *)(*(long *)(*(long *)&pBVar22->_workRegs +
                                               (ulong)**(uint **)(auStack_390 +
                                                                 (long)pBVar53 * 2 + 0x10) * 8) +
                                     0x4a);
            pBVar36 = (BaseRAPass *)(ulong)bVar59;
            pBVar38 = (BaseRAPass *)(ulong)*(uint *)(auStack_390 + (long)pBVar53);
            pBVar35 = (BaseRAPass *)
                      (ulong)((int)pBVar35 + (uint)bVar59 + (uint)(pBVar29 == pBVar38) * 2);
            pBVar53 = (BaseRAPass *)((long)&(pBVar53->super_FuncPass).super_Pass._vptr_Pass + 4);
            pBVar29 = (BaseRAPass *)((long)&(pBVar29->super_FuncPass).super_Pass._vptr_Pass + 1);
            pBVar33 = pBStack_430;
          } while (pBVar45 != pBVar53);
        }
        if ((uint)pBVar47 < (uint)pBVar35) {
          pBVar28 = (BaseRAPass *)(ulong)uVar26;
          pBVar47 = pBVar35;
        }
      }
      uVar49 = uVar49 - 1 & uVar49;
    } while (uVar49 != 0);
    if ((int)pBVar28 == -1) {
      return 0x3d;
    }
    pBVar29 = pBVar28;
    pBVar53 = pBVar33;
    if (uVar48 == 0) goto LAB_00122909;
    uVar31 = 0;
    while( true ) {
      uVar34 = 1 << ((byte)pBVar28 & 0x1f);
      pBVar40 = (BaseRAPass *)(ulong)uVar34;
      pBVar22 = *(BaseRAPass **)(auStack_390 + uVar31 + 0x10);
      uVar27 = *(uint *)&(pBVar22->super_FuncPass).super_Pass._vptr_Pass;
      pBVar45 = (BaseRAPass *)(ulong)uVar27;
      pBVar47 = (BaseRAPass *)0xffffffff;
      if (pBVar45 == (BaseRAPass *)0xffffffff) goto LAB_00123711;
      if ((((RAAssignment *)&pBVar33->field_0x48)->_layout).workCount <= uVar27) break;
      pBVar47 = (BaseRAPass *)((RAAssignment *)&pBVar33->field_0x48)->_workToPhysMap;
      BVar3 = *(BaseNode *)
               ((long)&pBVar47[1].super_FuncPass.super_Pass._vptr_Pass + (long)(pBVar45 + -1));
      pBVar45 = (BaseRAPass *)(ulong)(byte)BVar3;
      *(byte *)((long)&(pBVar22->super_FuncPass).super_Pass._cb + 6) = (byte)pBVar28;
      if ((uint)pBVar28 == (uint)(byte)BVar3) {
        uVar27 = *(uint *)&(pBVar22->super_FuncPass).super_Pass._cb;
        pBVar45 = (BaseRAPass *)(ulong)uVar27;
        pBVar47 = (BaseRAPass *)(ulong)(uVar27 | 0x100);
        *(uint *)&(pBVar22->super_FuncPass).super_Pass._cb = uVar27 | 0x100;
        if ((uVar27 & 2) != 0) {
          puVar50 = (((RAAssignment *)&pBVar33->field_0x48)->_physToWorkMap->dirty)._masks._data +
                    (long)pBVar57;
          *puVar50 = *puVar50 | uVar34;
        }
        pBVar55 = (BaseRAPass *)(ulong)((int)pBVar55 - 1);
      }
      else {
        pBVar32 = (BaseRAPass *)
                  (ulong)((uint)pBVar32 |
                         (((RAAssignment *)&pBVar33->field_0x48)->_physToWorkMap->assigned)._masks.
                         _data[(long)pBVar57] & uVar34);
      }
      uStack_41c = uStack_41c | uVar34;
      uVar31 = uVar31 + 8;
      pBVar28 = (BaseRAPass *)(ulong)((uint)pBVar28 + 1);
      pBVar29 = pBVar28;
      if (uVar48 << 3 == uVar31) goto LAB_00122909;
    }
    goto LAB_00123716;
  }
  pBStack_3d8 = (BaseRAPass *)0x0;
  pBVar29 = pBVar28;
LAB_00122909:
  pBVar58 = pBVar57;
  pBVar40 = pBVar43;
  if ((int)pBVar55 == 0) {
    pBVar55 = (BaseRAPass *)0x0;
LAB_00122c6a:
    pBStack_400 = (BaseRAPass *)CONCAT44(pBStack_400._4_4_,(int)pBVar55);
    if ((uint)pBVar32 != 0) {
      pBVar35 = (BaseRAPass *)
                (ulong)(~(uStack_41c | (uint)pBVar32 |
                         (((RAAssignment *)&pBVar53->field_0x48)->_physToWorkMap->assigned)._masks.
                         _data[(long)pBVar58] | uStack_3ec) &
                       (((RARegMask *)&pBVar53->_allocator)->_masks)._data[(long)pBVar58]);
      do {
        uVar46 = 0;
        if ((uint)pBVar32 != 0) {
          for (; ((uint)pBVar32 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
          }
        }
        pBVar36 = (BaseRAPass *)(ulong)uVar46;
        pPVar21 = ((RAAssignment *)&pBVar53->field_0x48)->_physToWorkMap;
        pBVar29 = pBVar36;
        if (((pPVar21->assigned)._masks._data[(long)pBVar58] >> (uVar46 & 0x1f) & 1) != 0) {
          puVar50 = (((RAAssignment *)&pBVar53->field_0x48)->_physToWorkIds)._data[(long)pBVar58];
          uVar37 = puVar50[(long)pBVar36];
          uVar27 = (uint)pBVar35;
          pBVar38 = pBVar58;
          pBStack_418 = pBVar32;
          if (uVar27 != 0) {
            pBVar38 = (BaseRAPass *)((ulong)pBVar58 & 0xff);
            pcStack_438 = (code *)0x122ce8;
            pBVar45 = pBVar35;
            pBVar47 = pBStack_3a0;
            uVar17 = decideOnReassignment
                               ((RALocalAllocator *)pBVar53,(RegGroup)pBVar58,uVar37,
                                (uint32_t)puVar50,uVar27,(RAInst *)pBStack_3a0);
            if (uVar17 != 0xff) {
              if (uVar17 != uVar46) {
                pBVar45 = (BaseRAPass *)(ulong)uVar46;
                pcStack_438 = (code *)0x122d4d;
                RAAssignment::reassign
                          ((RAAssignment *)pBStack_3f8,(RegGroup)pBVar58,uVar37,uVar17,uVar46);
                pBVar33 = (BaseRAPass *)(pBStack_430->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_438 = (code *)0x122d62;
                EVar14 = (*(pBVar33->super_FuncPass).super_Pass._vptr_Pass[9])
                                   (pBVar33,(ulong)uVar37,(ulong)uVar17,(ulong)uVar46);
                if (EVar14 != 0) {
                  return EVar14;
                }
              }
              pBVar29 = (BaseRAPass *)(ulong)uVar17;
              pBVar35 = (BaseRAPass *)(ulong)(uVar27 ^ 1 << (uVar17 & 0x1f));
              puVar50 = (((RARegMask *)&pBStack_430->field_0x28)->_masks)._data + (long)pBStack_428;
              *puVar50 = *puVar50 | 1 << ((byte)uVar17 & 0x1f);
              pBVar40 = pBStack_408;
              pBVar32 = pBStack_418;
              pBVar53 = pBStack_430;
              pBVar58 = pBStack_428;
              goto LAB_00122d90;
            }
            pPVar21 = ((RAAssignment *)&pBVar53->field_0x48)->_physToWorkMap;
            pBVar38 = pBStack_428;
          }
          if (((pPVar21->dirty)._masks._data[(long)pBVar38] & 1 << ((byte)uVar46 & 0x1f)) != 0) {
            pcStack_438 = (code *)0x122d10;
            EVar14 = onSaveReg((RALocalAllocator *)pBVar53,(RegGroup)pBVar38,uVar37,uVar46);
            if (EVar14 != 0) {
              return EVar14;
            }
          }
          pBVar29 = (BaseRAPass *)(ulong)uVar46;
          pcStack_438 = (code *)0x122d2b;
          RAAssignment::unassign((RAAssignment *)pBStack_3f8,(RegGroup)pBVar38,uVar37,uVar46);
          pBVar40 = pBStack_408;
          pBVar32 = pBStack_418;
          pBVar58 = pBVar38;
        }
LAB_00122d90:
        uVar46 = (uint)pBVar32 - 1 & (uint)pBVar32;
        pBVar32 = (BaseRAPass *)(ulong)uVar46;
      } while (uVar46 != 0);
    }
    pBVar22 = (BaseRAPass *)((ulong)pBStack_400 & 0xffffffff);
    pBVar32 = (BaseRAPass *)(ulong)uStack_420;
    pBVar41 = pBVar40;
    if ((uint)pBStack_400 != 0) {
      pBStack_3c8 = (BaseRAPass *)(ulong)(uint)((int)pBStack_3e0 << 5);
      pBVar29 = (BaseRAPass *)(ulong)(uint)((int)uStack_3a8 << 5);
      pBStack_3b8 = (BaseRAPass *)
                    ((long)&(pBStack_3b8->super_FuncPass).super_Pass._vptr_Pass +
                    (long)&pBVar29->field_0x5a);
      pBStack_3e8 = (BaseRAPass *)((ulong)pBStack_3e8 & 0xffffffff00000000);
      pBVar28 = pBVar53;
      do {
        pBVar42 = pBVar22;
        pBVar53 = pBVar28;
        if ((int)pBVar32 != 0) {
          pBVar38 = (BaseRAPass *)0x0;
          pBStack_400 = (BaseRAPass *)CONCAT44(pBStack_400._4_4_,(int)pBVar22);
          pBVar57 = pBVar58;
LAB_00122df5:
          pBVar58 = pBStack_428;
          pBVar53 = pBStack_430;
          if ((*(byte *)((long)&pBVar40->super_FuncPass + (long)pBVar38 * 0x20 + 9) & 1) != 0)
          goto LAB_001230c8;
          pBVar55 = (BaseRAPass *)((long)&pBVar40->super_FuncPass + (long)pBVar38 * 0x20);
          uVar46 = *(uint *)&(pBVar55->super_FuncPass).super_Pass._vptr_Pass;
          pBVar35 = (BaseRAPass *)(ulong)uVar46;
          if (pBVar35 != (BaseRAPass *)0xffffffff) {
            pBVar47 = pBVar22;
            if ((((RAAssignment *)&pBVar28->field_0x48)->_layout).workCount <= uVar46)
            goto LAB_001236b7;
            BVar3 = (BaseNode)
                    ((WorkToPhysMap *)
                    ((long)&(pBVar35->super_FuncPass).super_Pass._vptr_Pass +
                    (long)((RAAssignment *)&pBVar28->field_0x48)->_workToPhysMap))->physIds[0];
            pBVar36 = (BaseRAPass *)(ulong)(byte)BVar3;
            BVar4 = *(BaseNode *)((long)&(pBVar55->super_FuncPass).super_Pass._cb + 6);
            pBVar28 = (BaseRAPass *)(ulong)(byte)BVar4;
            if (BVar4 == BVar3) goto LAB_001236bc;
            pBVar33 = pBVar28;
            if (0x1f < (byte)BVar4) goto LAB_001236c1;
            uVar37 = *(uint *)(*(long *)(&pBStack_430->field_0x48 + (long)pBVar57 * 8 + 0x28) +
                              (long)pBVar28 * 4);
            pBVar57 = (BaseRAPass *)(ulong)uVar37;
            uVar48 = (uint)(byte)BVar4;
            uVar27 = (uint)(byte)BVar3;
            pBStack_418 = pBVar22;
            if (pBVar57 == (BaseRAPass *)0xffffffff) {
LAB_00122fc6:
              pBVar57 = pBStack_428;
              if (BVar3 == (BaseNode)0xff) {
                pBVar45 = (BaseRAPass *)0x0;
                pcStack_438 = (code *)0x12301a;
                RAAssignment::assign
                          ((RAAssignment *)pBStack_3f8,(RegGroup)pBStack_428,uVar46,uVar48,false);
                pBVar33 = (BaseRAPass *)(pBStack_430->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_438 = (code *)0x12302c;
                EVar14 = (*(pBVar33->super_FuncPass).super_Pass._vptr_Pass[0xb])
                                   (pBVar33,pBVar35,(ulong)uVar48);
              }
              else {
                pBVar45 = (BaseRAPass *)(ulong)uVar27;
                pcStack_438 = (code *)0x122fe9;
                RAAssignment::reassign
                          ((RAAssignment *)pBStack_3f8,(RegGroup)pBStack_428,uVar46,uVar48,uVar27);
                pBVar33 = (BaseRAPass *)(pBStack_430->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_438 = (code *)0x122ffd;
                EVar14 = (*(pBVar33->super_FuncPass).super_Pass._vptr_Pass[9])
                                   (pBVar33,pBVar35,(ulong)uVar48,(ulong)uVar27);
              }
              if (EVar14 != 0) {
                return EVar14;
              }
              uVar46 = *(uint *)&(pBVar55->super_FuncPass).super_Pass._cb;
              uVar37 = uVar46 | 0x100;
              pBVar29 = (BaseRAPass *)(ulong)uVar37;
              *(uint *)&(pBVar55->super_FuncPass).super_Pass._cb = uVar37;
              if ((uVar46 & 2) != 0) {
                pBVar29 = (BaseRAPass *)((RAAssignment *)&pBStack_430->field_0x48)->_physToWorkMap;
                puVar50 = (uint *)((long)(&pBVar29->_formatOptions + -10) + (long)pBVar57 * 4);
                *puVar50 = *puVar50 | 1 << ((byte)BVar4 & 0x1f);
              }
              pBVar22 = (BaseRAPass *)(ulong)((int)pBStack_418 - 1);
              pBVar40 = pBStack_408;
LAB_00123085:
              pBVar32 = (BaseRAPass *)(ulong)uStack_420;
              pBVar42 = (BaseRAPass *)((ulong)pBStack_400 & 0xffffffff);
              pBVar28 = pBStack_430;
              goto LAB_001230c8;
            }
            pp_Var51 = (pBStack_430->super_FuncPass).super_Pass._vptr_Pass;
            if (*(uint *)(pp_Var51 + 0x29) <= uVar37) goto LAB_001236c6;
            pBVar29 = pBVar28;
            if ((uVar27 != 0xff) &&
               (pcVar6 = (pBStack_430->super_FuncPass).super_Pass._name,
               bVar25 = *(byte *)((long)(&pBStack_428->_formatOptions + -10) + (long)pcVar6),
               pBVar29 = (BaseRAPass *)
                         (CONCAT71((int7)((ulong)pcVar6 >> 8),bVar25) & 0xffffffffffffff01),
               (bVar25 & 1) != 0)) {
              pp_Stack_3d0 = *(_func_int ***)(pp_Var51[0x28] + (long)pBVar57 * 8);
              pcStack_438 = (code *)0x122ec8;
              RAAssignment::swap((RAAssignment *)pBStack_3f8,(RegGroup)pBStack_428,uVar46,uVar27,
                                 uVar37,(uint)(byte)BVar4);
              pBVar33 = (BaseRAPass *)(pBStack_430->super_FuncPass).super_Pass._vptr_Pass;
              pcStack_438 = (code *)0x122edf;
              EVar14 = (*(pBVar33->super_FuncPass).super_Pass._vptr_Pass[10])
                                 (pBVar33,pBVar35,(ulong)uVar27,pBVar57,(ulong)(uint)(byte)BVar4);
              if (EVar14 != 0) {
                return EVar14;
              }
              uVar46 = *(uint *)&(pBVar55->super_FuncPass).super_Pass._cb;
              *(uint *)&(pBVar55->super_FuncPass).super_Pass._cb = uVar46 | 0x100;
              if ((uVar46 & 2) != 0) {
                puVar50 = (((RAAssignment *)&pBStack_430->field_0x48)->_physToWorkMap->dirty)._masks
                          ._data + (long)pBStack_428;
                *puVar50 = *puVar50 | 1 << ((byte)BVar4 & 0x1f);
              }
              pBVar22 = (BaseRAPass *)(ulong)((int)pBStack_418 - 1);
              pBVar29 = (BaseRAPass *)0x0;
              pBVar42 = (BaseRAPass *)((ulong)pBStack_400 & 0xffffffff);
              do {
                pBVar28 = pBStack_430;
                pBVar40 = pBStack_408;
                pBVar45 = pBStack_3c8;
                if (*(int *)(&pBStack_3b8[-1].field_0x3b0 + 0xf2 + (long)pBVar29) ==
                    *(int *)pp_Stack_3d0) {
                  pBVar32 = (BaseRAPass *)(ulong)uStack_420;
                  pBVar57 = pBStack_428;
                  if (*(BaseNode *)
                       ((long)&pBStack_3b8[1].super_FuncPass.super_Pass._vptr_Pass +
                       (long)(pBVar29 + -1)) != BVar3) goto LAB_001230c8;
                  uVar46 = *(uint *)(&pBStack_3b8[-1].field_0x3b0 + 0xfa + (long)pBVar29);
                  *(uint *)(&pBStack_3b8[-1].field_0x3b0 + 0xfa + (long)pBVar29) = uVar46 | 0x100;
                  if ((uVar46 & 2) != 0) {
                    pBVar29 = (BaseRAPass *)
                              ((RAAssignment *)&pBStack_430->field_0x48)->_physToWorkMap;
                    puVar50 = (uint *)((long)(&pBVar29->_formatOptions + -10) +
                                      (long)pBStack_428 * 4);
                    *puVar50 = *puVar50 | 1 << ((byte)BVar3 & 0x1f);
                  }
                  pBVar22 = (BaseRAPass *)(ulong)((int)pBStack_418 - 2);
                  break;
                }
                pBVar29 = (BaseRAPass *)&pBVar29->field_0x20;
              } while (pBStack_3c8 != pBVar29);
              pBVar32 = (BaseRAPass *)(ulong)uStack_420;
              pBVar57 = pBStack_428;
              goto LAB_001230c8;
            }
            pBVar57 = pBStack_428;
            if (((ulong)pBStack_3e8 & 1) == 0) goto LAB_00123085;
            uVar34 = ~*(uint *)(*(long *)(&pBStack_430->field_0x48 + 0x20) + (long)pBStack_428 * 4)
                     & *(uint *)(&pBStack_430->_allocator + (long)pBStack_428 * 4);
            if (uVar34 == 0) {
              if ((*(uint *)(*(long *)(&pBStack_430->field_0x48 + 0x20) + 0x10 +
                            (long)pBStack_428 * 4) >> (uVar48 & 0x1f) & 1) != 0) {
                pcStack_438 = (code *)0x122fa5;
                EVar14 = onSaveReg((RALocalAllocator *)pBStack_430,(RegGroup)pBStack_428,uVar37,
                                   uVar48);
                if (EVar14 != 0) {
                  return EVar14;
                }
              }
              pcStack_438 = (code *)0x122fc6;
              RAAssignment::unassign
                        ((RAAssignment *)pBStack_3f8,(RegGroup)pBStack_428,uVar37,uVar48);
              goto LAB_00122fc6;
            }
            uVar37 = ~*(uint *)(&pBStack_430->field_0x38 + (long)pBStack_428 * 4) & uVar34;
            if (uVar37 == 0) {
              uVar37 = uVar34;
            }
            uVar48 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
              }
            }
            if (uVar48 != uVar27) {
              pBVar45 = (BaseRAPass *)(ulong)uVar27;
              pcStack_438 = (code *)0x123123;
              RAAssignment::reassign
                        ((RAAssignment *)pBStack_3f8,(RegGroup)pBStack_428,uVar46,uVar48,uVar27);
              pp_Var51 = (pBVar53->super_FuncPass).super_Pass._vptr_Pass;
              pcStack_438 = (code *)0x123134;
              EVar14 = (**(code **)(*pp_Var51 + 0x48))(pp_Var51,pBVar35,uVar48,BVar3);
              pBVar40 = pBStack_408;
              pBVar38 = pBVar58;
              if (EVar14 != 0) {
                return EVar14;
              }
            }
            pBVar29 = (BaseRAPass *)(ulong)uVar48;
            *(uint *)(&pBVar53->field_0x28 + (long)pBVar58 * 4) =
                 *(uint *)(&pBVar53->field_0x28 + (long)pBVar58 * 4) | 1 << ((byte)uVar48 & 0x1f);
            pBVar32 = (BaseRAPass *)(ulong)uStack_420;
            pBVar42 = (BaseRAPass *)((ulong)pBStack_400 & 0xffffffff);
            goto LAB_001230d9;
          }
          pcStack_438 = (code *)0x1236b7;
          allocInst();
          pBVar47 = pBVar22;
LAB_001236b7:
          pcStack_438 = (code *)0x1236bc;
          allocInst();
LAB_001236bc:
          pcStack_438 = (code *)0x1236c1;
          allocInst();
          pBVar33 = pBVar28;
LAB_001236c1:
          pBVar28 = pBVar29;
          pcStack_438 = (code *)0x1236c6;
          allocInst();
LAB_001236c6:
          pcStack_438 = (code *)0x1236cb;
          allocInst();
          goto LAB_001236cb;
        }
LAB_001230d9:
        pBVar29 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar29 >> 8),(int)pBVar42 == (int)pBVar22);
        pBStack_3e8 = (BaseRAPass *)CONCAT44(pBStack_3e8._4_4_,(int)pBVar29);
        pBVar41 = pBVar40;
        pBVar28 = pBVar53;
      } while ((int)pBVar22 != 0);
    }
    cVar60 = uStack_40c == 0;
    pBVar36 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar36 >> 8),cVar60);
    if ((bool)cVar60) {
      pBStack_3e0 = (BaseRAPass *)0x0;
      uStack_40c = 0;
      pBVar56 = (BaseRAPass *)(ulong)uStack_3ec;
      pBVar57 = pBVar58;
      cVar60 = cStack_40d;
    }
    else {
      pBStack_3e0 = (BaseRAPass *)(ulong)uStack_40c;
      pBVar55 = (BaseRAPass *)0x0;
      pBVar56 = (BaseRAPass *)(ulong)uStack_3ec;
      do {
        pBVar38 = (BaseRAPass *)alStack_350[(long)pBVar55];
        uVar46 = *(uint *)&(pBVar38->super_FuncPass).super_Pass._vptr_Pass;
        pBVar32 = (BaseRAPass *)(ulong)uVar46;
        if (pBVar32 == (BaseRAPass *)0xffffffff) goto LAB_001236d5;
        if ((((RAAssignment *)&pBVar53->field_0x48)->_layout).workCount <= uVar46)
        goto LAB_001236da;
        bVar25 = ((WorkToPhysMap *)
                 ((long)&(pBVar32->super_FuncPass).super_Pass._vptr_Pass +
                 (long)((RAAssignment *)&pBVar53->field_0x48)->_workToPhysMap))->physIds[0];
        pBVar35 = (BaseRAPass *)(ulong)bVar25;
        uVar37 = (uint)bVar25;
        if (uVar37 != 0xff) {
          pBVar41 = (BaseRAPass *)((ulong)pBStack_428 & 0xff);
          pBVar29 = (BaseRAPass *)(ulong)uVar37;
          pcStack_438 = (code *)0x1231cb;
          pBVar22 = pBStack_3f8;
          RAAssignment::unassign((RAAssignment *)pBStack_3f8,(RegGroup)pBStack_428,uVar46,uVar37);
          pBVar56 = (BaseRAPass *)(ulong)((uint)pBVar56 & ~(1 << (bVar25 & 0x1f)));
          pBVar32 = extraout_RDX_00;
        }
        uStack_40c = (uStack_40c - 1) +
                     (uint)((*(uint *)&(pBVar38->super_FuncPass).super_Pass._cb >> 3 & 1) != 0);
        pBVar55 = (BaseRAPass *)((long)&(pBVar55->super_FuncPass).super_Pass._vptr_Pass + 1);
        pBVar57 = pBStack_428;
      } while (pBStack_3e0 != pBVar55);
    }
    goto LAB_00123209;
  }
  if (uVar37 == 0) goto LAB_00122c6a;
  pBVar22 = (BaseRAPass *)
            (ulong)(~(uint)pBVar32 &
                   (((RAAssignment *)&pBVar53->field_0x48)->_physToWorkMap->assigned)._masks._data
                   [(long)pBVar57]);
  uVar46 = uVar46 << 5;
  pBVar38 = (BaseRAPass *)
            ((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
            ((ulong)uVar46 - 0xc));
  pBVar45 = (BaseRAPass *)(ulong)(uVar37 << 5);
  pBVar36 = (BaseRAPass *)0x0;
  pBVar29 = pBVar41;
  pBStack_3e8 = pBVar45;
  while (uVar37 = *(uint *)((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
                            ((ulong)uVar46 - 0x1c) + (long)pBVar36), (uVar37 >> 8 & 1) != 0) {
LAB_00122bd1:
    pBVar36 = (BaseRAPass *)&pBVar36->field_0x20;
    pBVar40 = pBVar43;
    pBVar58 = pBVar57;
    if (pBVar45 == pBVar36) goto LAB_00122c6a;
  }
  uVar27 = *(uint *)((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
                     ((ulong)uVar46 - 0x24) + (long)pBVar36);
  pBVar35 = (BaseRAPass *)(ulong)uVar27;
  pBVar28 = (BaseRAPass *)0xffffffff;
  if (pBVar35 == (BaseRAPass *)0xffffffff) goto LAB_00123702;
  if ((((RAAssignment *)&pBVar53->field_0x48)->_layout).workCount <= uVar27) goto LAB_00123707;
  pBVar28 = (BaseRAPass *)((RAAssignment *)&pBVar53->field_0x48)->_workToPhysMap;
  BVar3 = *(BaseNode *)
           ((long)&pBVar28[1].super_FuncPass.super_Pass._vptr_Pass + (long)(pBVar35 + -1));
  pBVar53 = (BaseRAPass *)(ulong)(byte)BVar3;
  iVar15 = (int)pBVar55;
  if ((((uStack_398 & 1) != 0) || ((uVar37 & 0x10) == 0)) || (BVar3 != (BaseNode)0xff)) {
LAB_00122995:
    pBVar29 = pBVar28;
    pBVar53 = pBStack_430;
    pBVar57 = pBStack_428;
    if (*(BaseNode *)
         ((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
          ((ulong)uVar46 - 0x16) + (long)pBVar36) == (BaseNode)0xff) {
      pBStack_400 = (BaseRAPass *)CONCAT44(pBStack_400._4_4_,(int)pBVar22);
      pp_Stack_3d0 = (_func_int **)CONCAT44(pp_Stack_3d0._4_4_,(uint)(RegGroup)pBStack_428);
      pcStack_438 = (code *)0x122aeb;
      uVar17 = decideOnAssignment((RALocalAllocator *)pBStack_430,(RegGroup)pBStack_428,uVar27,
                                  (uint32_t)pBVar28,
                                  ~(uStack_41c | (uint)pBVar32) &
                                  *(uint *)((long)(((RAAssignment *)&pBVar41->field_0x48)->
                                                  _physToWorkIds)._data + ((ulong)uVar46 - 0x14) +
                                           (long)pBVar36));
      pBVar29 = (BaseRAPass *)(ulong)uVar17;
      uVar37 = 1 << ((byte)SUB41(uVar17,0) & 0x1f);
      pBVar47 = (BaseRAPass *)(ulong)uVar37;
      uVar48 = (uint)pBVar32 | uVar37 & (uint)pBStack_400;
      pBVar32 = (BaseRAPass *)(ulong)uVar48;
      *(BaseNode *)
       ((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
        ((ulong)uVar46 - 0x16) + (long)pBVar36) = SUB41(uVar17,0);
      uVar34 = (uint)(byte)BVar3;
      pBVar53 = pBStack_430;
      if (uVar34 == 0xff) {
        uVar48 = (uint)pBStack_400;
        if ((uVar37 & (uint)pBStack_400) == 0) {
          pBStack_3c8 = (BaseRAPass *)CONCAT44(pBStack_3c8._4_4_,uVar37);
          pcStack_438 = (code *)0x122c03;
          pBStack_418 = pBVar32;
          RAAssignment::assign
                    ((RAAssignment *)pBStack_3f8,(RegGroup)pp_Stack_3d0,uVar27,uVar17,false);
          pBVar53 = pBStack_430;
          pBVar33 = (BaseRAPass *)(pBStack_430->super_FuncPass).super_Pass._vptr_Pass;
          pcStack_438 = (code *)0x122c19;
          EVar14 = (*(pBVar33->super_FuncPass).super_Pass._vptr_Pass[0xb])(pBVar33,pBVar35,pBVar29);
          if (EVar14 != 0) {
            return EVar14;
          }
          uVar37 = *(uint *)((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
                             ((ulong)uVar46 - 0x1c) + (long)pBVar36);
          *(uint *)((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
                    ((ulong)uVar46 - 0x1c) + (long)pBVar36) = uVar37 | 0x100;
          pBVar47 = (BaseRAPass *)((ulong)pBStack_3c8 & 0xffffffff);
          if ((uVar37 & 2) != 0) {
            puVar50 = (((RAAssignment *)&pBVar53->field_0x48)->_physToWorkMap->dirty)._masks._data +
                      (long)pBStack_428;
            *puVar50 = *puVar50 | (uint)pBStack_3c8;
          }
          pBVar55 = (BaseRAPass *)(ulong)(iVar15 - 1);
          pBVar35 = pBVar29;
          pBVar32 = pBStack_418;
          uVar48 = (uint)pBStack_400;
        }
      }
      else {
        pBVar32 = (BaseRAPass *)(ulong)(uVar48 | 1 << (uVar34 & 0x1f));
        uVar48 = (uint)pBStack_400 & ~(1 << (uVar34 & 0x1f));
        if ((uVar37 & uVar48) == 0) {
          if (uVar17 != uVar34) {
            pBStack_400 = (BaseRAPass *)CONCAT44(pBStack_400._4_4_,uVar48);
            pBStack_3c8 = (BaseRAPass *)CONCAT44(pBStack_3c8._4_4_,uVar37);
            pcStack_438 = (code *)0x122b51;
            pBStack_418 = pBVar32;
            RAAssignment::reassign
                      ((RAAssignment *)pBStack_3f8,(RegGroup)pp_Stack_3d0,uVar27,uVar17,
                       (uint)(byte)BVar3);
            pBVar33 = (BaseRAPass *)(pBStack_430->super_FuncPass).super_Pass._vptr_Pass;
            pcStack_438 = (code *)0x122b66;
            EVar14 = (*(pBVar33->super_FuncPass).super_Pass._vptr_Pass[9])
                               (pBVar33,pBVar35,pBVar29,(ulong)(byte)BVar3);
            pBVar47 = (BaseRAPass *)((ulong)pBStack_3c8 & 0xffffffff);
            pBVar32 = pBStack_418;
            uVar48 = (uint)pBStack_400;
            if (EVar14 != 0) {
              return EVar14;
            }
          }
          uVar37 = *(uint *)((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
                             ((ulong)uVar46 - 0x1c) + (long)pBVar36);
          *(uint *)((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
                    ((ulong)uVar46 - 0x1c) + (long)pBVar36) = uVar37 | 0x100;
          if ((uVar37 & 2) != 0) {
            puVar50 = (((RAAssignment *)&pBStack_430->field_0x48)->_physToWorkMap->dirty)._masks.
                      _data + (long)pBStack_428;
            *puVar50 = *puVar50 | (uint)pBVar47;
          }
          pBVar55 = (BaseRAPass *)(ulong)(iVar15 - 1);
          pBVar53 = pBStack_430;
        }
      }
      uStack_41c = uStack_41c | 1 << (uVar17 & 0x1f);
      pBVar22 = (BaseRAPass *)(ulong)(uVar48 | (uint)pBVar47);
      pBVar43 = pBStack_408;
      pBVar45 = pBStack_3e8;
      pBVar57 = pBStack_428;
    }
    goto LAB_00122bd1;
  }
  uVar37 = *(uint *)((long)&pBVar38->_archTraits + (long)&pBVar36[-1].field_0x3b0);
  pBVar57 = (BaseRAPass *)(ulong)uVar37;
  uVar48 = uVar37 ^ uVar37 - 1;
  pBVar28 = (BaseRAPass *)(ulong)uVar48;
  if (uVar48 <= uVar37 - 1) goto LAB_00122995;
  pp_Var51 = (pBStack_430->super_FuncPass).super_Pass._vptr_Pass;
  if (uVar27 < *(uint *)(pp_Var51 + 0x29)) {
    pBVar28 = *(BaseRAPass **)(pp_Var51[0x28] + (long)pBVar35 * 8);
    BVar4 = *(BaseNode *)
             ((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
              ((ulong)uVar46 - 0x17) + (long)pBVar36);
    pBVar47 = (BaseRAPass *)(ulong)(byte)BVar4;
    pBVar44 = (BaseCompiler *)(pBVar28->super_FuncPass).super_Pass._cb;
    uVar48._0_1_ = (pBVar44->super_BaseBuilder).super_BaseEmitter._emitterType;
    uVar48._1_1_ = (pBVar44->super_BaseBuilder).super_BaseEmitter._emitterFlags;
    uVar48._2_1_ = (pBVar44->super_BaseBuilder).super_BaseEmitter._instructionAlignment;
    uVar48._3_1_ = (pBVar44->super_BaseBuilder).super_BaseEmitter._reservedBaseEmitter;
    if ((byte)BVar4 <= uVar48) {
      if (*(long *)(((RARegMask *)&pBVar28->_allocator)->_masks)._data == 0) {
        pBStack_400 = (BaseRAPass *)CONCAT44(pBStack_400._4_4_,(int)pBVar22);
        pcStack_438 = (code *)0x122a33;
        pBStack_418 = pBVar32;
        pp_Stack_3d0 = pp_Var51;
        pRVar20 = RAStackAllocator::newSlot
                            ((RAStackAllocator *)(pp_Var51 + 0x3f),
                             *(uint32_t *)((long)pp_Var51 + 0x1dc),uVar48,
                             (uint)(byte)(char)(pBVar44->super_BaseBuilder).super_BaseEmitter.
                                               _validationFlags,1);
        pBVar22 = (BaseRAPass *)((ulong)pBStack_400 & 0xffffffff);
        *(RAStackSlot **)(((RARegMask *)&pBVar28->_allocator)->_masks)._data = pRVar20;
        pBVar28->field_0x25 = pBVar28->field_0x25 | 1;
        pBVar43 = pBStack_408;
        pBVar45 = pBStack_3e8;
        pBVar32 = pBStack_418;
        pp_Var51 = pp_Stack_3d0;
      }
      uVar27 = 0;
      if (uVar37 != 0) {
        for (; (uVar37 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
        }
      }
      pIVar39 = (InstNode *)(auStack_390._56_8_ + (ulong)(uVar27 & 0xfffffffc) * 4);
      uVar37 = *(uint *)(pp_Var51 + 0x3b);
      *(uint32_t *)(pIVar39 + 4) =
           *(uint32_t *)((long)&(pBVar28->super_FuncPass).super_Pass._vptr_Pass + 4);
      *(undefined8 *)(pIVar39 + 8) = 0;
      pBVar47 = (BaseRAPass *)((ulong)(byte)BVar4 << 0x18);
      uVar37 = (uVar37 & 0xf8) + (int)pBVar47 + 0x2002;
      pBVar29 = (BaseRAPass *)(ulong)uVar37;
      *(uint *)pIVar39 = uVar37;
      *(undefined4 *)((long)&pBVar38->_archTraits + (long)&pBVar36[-1].field_0x3b0) = 0;
      pBVar8 = (BaseNode *)
               ((long)(((RAAssignment *)&pBVar41->field_0x48)->_physToWorkIds)._data +
                ((ulong)uVar46 - 0x1b) + (long)pBVar36);
      *pBVar8 = (BaseNode)((byte)*pBVar8 | 1);
      puVar11 = (undefined1 *)((long)&(pBStack_3a0->super_FuncPass).super_Pass._cb + 7);
      *puVar11 = *puVar11 | 0x40;
      pBVar55 = (BaseRAPass *)(ulong)(iVar15 - 1);
      uStack_398 = CONCAT71((int7)((ulong)pBStack_3a0 >> 8),1);
      pBVar35 = pBVar28;
      pBVar53 = pBStack_430;
      pBVar57 = pBStack_428;
      goto LAB_00122bd1;
    }
    goto LAB_00122995;
  }
LAB_00123720:
  pcStack_438 = (code *)0x123725;
  allocInst();
LAB_00123725:
  pcStack_438 = decideOnAssignment;
  allocInst();
  uVar46 = (uint)pBVar45;
  if (uVar46 == 0) {
    pBStack_440 = (BaseRAPass *)0x123782;
    decideOnAssignment();
LAB_00123782:
    pBStack_440 = (BaseRAPass *)0x123787;
    decideOnAssignment();
  }
  else {
    pBVar33 = (BaseRAPass *)(pBVar22->super_FuncPass).super_Pass._vptr_Pass;
    if (*(uint *)&pBVar33->field_0x148 <= extraout_EDX) goto LAB_00123782;
    pBVar28 = *(BaseRAPass **)(*(long *)&pBVar33->_workRegs + (ulong)extraout_EDX * 8);
    bVar25 = (((RAAssignment *)&pBVar28->field_0x48)->_layout).physIndex.super_RARegCount.field_0.
             _regs[2];
    if ((bVar25 != 0xff) && ((uVar46 >> (bVar25 & 0x1f) & 1) != 0)) {
      return (uint)bVar25;
    }
    if ((byte)pBVar43 < 4) {
      uVar37 = (((RARegMask *)&pBVar28->field_0x38)->_masks)._data[1] & uVar46;
      if (uVar37 == 0) {
        uVar37 = uVar46;
      }
      uVar46 = ~(((RARegMask *)&pBVar22->field_0x38)->_masks)._data[(ulong)pBVar43 & 0xff] & uVar37;
      if (uVar46 == 0) {
        uVar46 = uVar37;
      }
      EVar14 = 0;
      if (uVar46 != 0) {
        for (; (uVar46 >> EVar14 & 1) == 0; EVar14 = EVar14 + 1) {
        }
        return EVar14;
      }
      return 0;
    }
  }
  uVar46 = (uint)pBVar28;
  pBStack_440 = (BaseRAPass *)decideOnReassignment;
  decideOnAssignment();
  uVar37 = (uint)pBVar45;
  pBStack_440 = pBVar35;
  if (uVar37 == 0) {
    pBStack_448 = (BaseRAPass *)0x12385b;
    decideOnReassignment();
LAB_0012385b:
    pBStack_448 = (BaseRAPass *)0x123860;
    decideOnReassignment();
  }
  else {
    pBVar33 = (BaseRAPass *)(pBVar22->super_FuncPass).super_Pass._vptr_Pass;
    if (*(uint *)&pBVar33->field_0x148 <= extraout_EDX_00) goto LAB_0012385b;
    lVar18 = *(long *)(*(long *)&pBVar33->_workRegs + (ulong)extraout_EDX_00 * 8);
    bVar25 = *(byte *)(lVar18 + 0x4a);
    if ((bVar25 != 0xff) && ((uVar37 >> (bVar25 & 0x1f) & 1) != 0)) {
      return (uint)bVar25;
    }
    uVar46 = extraout_EDX_00;
    if ((byte)pBVar43 < 4) {
      bVar25 = *(byte *)((long)(((RARegMask *)&pBVar47->_allocator)->_masks)._data +
                        ((ulong)pBVar43 & 0xff));
      if (bVar25 == 0) goto LAB_0012382f;
      uVar46 = *(uint *)((long)&(pBVar47->super_FuncPass).super_Pass._name + 4) >>
               ((byte)pBVar43 * '\b' & 0x1f) & 0xff;
      lVar52 = 0;
      goto LAB_00123806;
    }
  }
  pBStack_448 = (BaseRAPass *)0x123865;
  decideOnReassignment();
  pBStack_468 = pBVar35;
  pBStack_460 = pBVar38;
  pBStack_458 = pBVar55;
  pBStack_450 = pBVar57;
  pBStack_448 = pBVar36;
  if (uVar46 == 0) {
LAB_00123944:
    pBStack_470 = (BaseRAPass *)0x123949;
    decideOnSpillFor();
LAB_00123949:
    pBStack_470 = (BaseRAPass *)0x12394e;
    decideOnSpillFor();
  }
  else {
    if (3 < (byte)pBVar43) goto LAB_00123949;
    uVar37 = 0;
    if (uVar46 != 0) {
      for (; (uVar46 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
      }
    }
    uVar31 = (ulong)pBVar43 & 0xff;
    pBVar43 = (BaseRAPass *)(((RAAssignment *)&pBVar22->field_0x48)->_physToWorkIds)._data[uVar31];
    uVar27 = (((RARegMask *)&pBVar43->_allocator)->_masks)._data[(ulong)uVar37 - 6];
    pBVar33 = (BaseRAPass *)(ulong)uVar27;
    uVar46 = uVar46 - 1 & uVar46;
    if (uVar46 == 0) {
LAB_00123933:
      *(uint *)&(pBVar45->super_FuncPass).super_Pass._vptr_Pass = uVar27;
      return uVar37;
    }
    pBVar47 = (BaseRAPass *)(pBVar22->super_FuncPass).super_Pass._vptr_Pass;
    uVar48 = *(uint *)&pBVar47->field_0x148;
    if (uVar27 < uVar48) {
      lVar18 = *(long *)&pBVar47->_workRegs;
      uVar49 = (uint)(*(float *)(*(long *)(lVar18 + (long)pBVar33 * 8) + 100) * 1048576.0);
      uVar34 = (((RAAssignment *)&pBVar22->field_0x48)->_physToWorkMap->dirty)._masks._data[uVar31];
      pBVar22 = (BaseRAPass *)(ulong)uVar34;
      uVar27 = uVar49 + 0x40000;
      if ((uVar34 >> (uVar37 & 0x1f) & 1) == 0) {
        uVar27 = uVar49;
      }
      pBVar47 = (BaseRAPass *)(ulong)uVar27;
      while( true ) {
        uVar49 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
          }
        }
        pBVar35 = (BaseRAPass *)(ulong)uVar49;
        uVar27 = (((RARegMask *)&pBVar43->_allocator)->_masks)._data
                 [(long)(&pBVar35[-1].field_0x3b0 + 0xfa)];
        pBVar55 = (BaseRAPass *)(ulong)uVar27;
        if (uVar48 <= uVar27) break;
        uVar27 = (uint)(*(float *)(*(long *)(lVar18 + (long)pBVar55 * 8) + 100) * 1048576.0);
        pBVar57 = (BaseRAPass *)(ulong)uVar27;
        pBVar38 = (BaseRAPass *)(ulong)(uVar27 + 0x40000);
        if ((uVar34 >> (uVar49 & 0x1f) & 1) == 0) {
          pBVar38 = pBVar57;
        }
        bVar59 = (uint)pBVar38 < (uint)pBVar47;
        if (bVar59) {
          pBVar33 = pBVar55;
          pBVar47 = pBVar38;
        }
        uVar27 = (uint)pBVar33;
        if (bVar59) {
          uVar37 = uVar49;
        }
        uVar46 = uVar46 - 1 & uVar46;
        pBVar36 = (BaseRAPass *)(ulong)uVar46;
        if (uVar46 == 0) goto LAB_00123933;
      }
      pBStack_470 = (BaseRAPass *)0x123944;
      decideOnSpillFor();
      goto LAB_00123944;
    }
  }
  pBStack_470 = (BaseRAPass *)0x123953;
  decideOnSpillFor();
  lVar18 = *(long *)&pBVar43->field_0x20;
  pIVar39 = (InstNode *)(ulong)*(uint *)(lVar18 + 0x10);
  if (pIVar39 == (InstNode *)0x0) {
    return 0;
  }
  pBStack_4b0 = (BaseRAPass *)&pBVar22->field_0x48;
  lVar52 = lVar18 + 0x54;
  pIVar54 = (InstNode *)0x0;
  pBVar33 = pBVar22;
  pIStack_4a8 = pIVar39;
  pBStack_4a0 = pBVar43;
  pBStack_498 = pBVar35;
  pBStack_490 = pBVar38;
  pBStack_488 = pBVar53;
  pBStack_480 = pBVar55;
  pBStack_478 = pBVar57;
  pBStack_470 = pBVar36;
  do {
    if ((InstNode *)(ulong)*(uint *)(lVar18 + 0x10) <= pIVar54) {
      pBStack_4c8 = (BaseRAPass *)0x123a70;
      spillAfterAllocation();
LAB_00123a70:
      pBStack_4c8 = (BaseRAPass *)0x123a75;
      spillAfterAllocation();
LAB_00123a75:
      pBStack_4c8 = (BaseRAPass *)0x123a7a;
      spillAfterAllocation();
LAB_00123a7a:
      pBStack_4c8 = (BaseRAPass *)0x123a7f;
      spillAfterAllocation();
LAB_00123a7f:
      pBStack_4c8 = (BaseRAPass *)allocBranch;
      spillAfterAllocation();
      (((BaseCompiler *)(pBVar33->super_FuncPass).super_Pass._cb)->super_BaseBuilder)._cursor =
           *(BaseNode **)pIVar39;
      lStack_4f0 = lVar52;
      pBStack_4e8 = pBVar38;
      pIStack_4e0 = pIVar54;
      pBStack_4d8 = pBVar22;
      lStack_4d0 = lVar18;
      pBStack_4c8 = pBVar36;
      if ((*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) &&
         (EVar14 = switchToAssignment((RALocalAllocator *)pBVar33,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true), EVar14 != 0)
         ) {
        return EVar14;
      }
      EVar14 = allocInst((RALocalAllocator *)pBVar33,pIVar39);
      if (EVar14 != 0) {
        return EVar14;
      }
      uVar46 = *(uint *)(block + 0xb8);
      if ((ulong)uVar46 == 0xffffffff) {
        pRVar23 = block + 0xbc;
LAB_00123b18:
        EVar14 = spillScratchGpRegsBeforeEntry((RALocalAllocator *)pBVar33,*(RegMask *)pRVar23);
        if (EVar14 != 0) {
          return EVar14;
        }
        pBVar45 = (BaseRAPass *)(pBVar33->super_FuncPass).super_Pass._vptr_Pass;
        if (*(long *)(block + 200) == 0) {
          EVar14 = BaseRAPass::setBlockEntryAssignment
                             (pBVar45,block,*(RABlock **)&pBVar33->field_0xd8,
                              (RAAssignment *)&pBVar33->field_0x48);
          if (EVar14 != 0) {
            return EVar14;
          }
        }
        else {
          pBVar8 = *(BaseNode **)pBVar45->_extraBlock;
          pBVar24 = BaseBuilder::setCursor
                              ((BaseBuilder *)(pBVar33->super_FuncPass).super_Pass._cb,pBVar8);
          __src = ((RAAssignment *)&pBVar33->field_0x48)->_workToPhysMap;
          memcpy(*(PhysToWorkMap **)&(pBVar33->_blocks).field_0x0,
                 ((RAAssignment *)&pBVar33->field_0x48)->_physToWorkMap,
                 (ulong)*(uint *)&pBVar33->_func * 4 + 0x20);
          memcpy(pBVar33->_extraBlock,__src,(ulong)*(uint32_t *)((long)&pBVar33->_func + 4));
          EVar14 = switchToAssignment((RALocalAllocator *)pBVar33,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
          if (EVar14 != 0) {
            return EVar14;
          }
          pBVar44 = (BaseCompiler *)(pBVar33->super_FuncPass).super_Pass._cb;
          if ((pBVar44->super_BaseBuilder)._cursor != pBVar8) {
            if ((uint)(byte)pIVar39[0x13] <= (byte)pIVar39[0x12] - 1) goto LAB_00123cba;
            lVar18 = (ulong)((byte)pIVar39[0x12] - 1) * 0x10;
            if ((*(uint *)(pIVar39 + lVar18 + 0x40) & 7) != 5) goto LAB_00123cbf;
            (*(pBVar44->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_518);
            uStack_508 = *(undefined8 *)(pIVar39 + lVar18 + 0x40);
            uStack_500 = *(undefined8 *)(pIVar39 + lVar18 + 0x48);
            *(undefined4 *)(pIVar39 + lVar18 + 0x40) = uStack_518;
            *(undefined4 *)(pIVar39 + lVar18 + 0x44) = uStack_514;
            *(undefined4 *)(pIVar39 + lVar18 + 0x48) = uStack_510;
            *(undefined4 *)(pIVar39 + lVar18 + 0x4c) = uStack_50c;
            pIVar39[0x34] = (InstNode)((byte)pIVar39[0x34] & 0xef);
            EVar14 = (*(((BaseRAPass *)(pBVar33->super_FuncPass).super_Pass._vptr_Pass)->
                       super_FuncPass).super_Pass._vptr_Pass[0xd])();
            if (EVar14 != 0) {
              return EVar14;
            }
            pBVar44 = (BaseCompiler *)(pBVar33->super_FuncPass).super_Pass._cb;
            (pBVar44->super_BaseBuilder)._cursor = pBVar8;
            (*(pBVar44->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                      (pBVar44,&uStack_518);
            pBVar44 = (BaseCompiler *)(pBVar33->super_FuncPass).super_Pass._cb;
          }
          (pBVar44->super_BaseBuilder)._cursor = pBVar24;
          pBVar8 = (BaseNode *)((RAAssignment *)&pBVar33->field_0x48)->_workToPhysMap;
          pPVar21 = ((RAAssignment *)&pBVar33->field_0x48)->_physToWorkMap;
          pPVar9 = *(PhysToWorkMap **)&(pBVar33->_blocks).field_0x0;
          ((RAAssignment *)&pBVar33->field_0x48)->_workToPhysMap =
               (WorkToPhysMap *)pBVar33->_extraBlock;
          ((RAAssignment *)&pBVar33->field_0x48)->_physToWorkMap = pPVar9;
          pBVar33->_extraBlock = pBVar8;
          *(PhysToWorkMap **)&(pBVar33->_blocks).field_0x0 = pPVar21;
          lVar18 = 0;
          do {
            ppuVar1 = (((RAAssignment *)&pBVar33->field_0x48)->_physToWorkIds)._data + lVar18;
            puVar50 = *ppuVar1;
            puVar30 = ppuVar1[1];
            puVar10 = (uint *)((undefined8 *)((long)(&pBVar33->_formatOptions + 4) + lVar18 * 8))[1]
            ;
            ppuVar1 = (((RAAssignment *)&pBVar33->field_0x48)->_physToWorkIds)._data + lVar18;
            *ppuVar1 = *(uint **)((long)(&pBVar33->_formatOptions + 4) + lVar18 * 8);
            ppuVar1[1] = puVar10;
            *(undefined8 *)((long)(&pBVar33->_formatOptions + 4) + lVar18 * 8) = puVar50;
            ((undefined8 *)((long)(&pBVar33->_formatOptions + 4) + lVar18 * 8))[1] = puVar30;
            lVar18 = lVar18 + 2;
          } while (lVar18 != 4);
        }
        EVar14 = 0;
      }
      else {
        if (uVar46 < *(uint *)(*(long *)block + 0xf0)) {
          pRVar23 = (RABlock *)((ulong)uVar46 * 0x20 + *(long *)(*(long *)block + 0xe8));
          goto LAB_00123b18;
        }
        allocBranch();
LAB_00123cba:
        allocBranch();
LAB_00123cbf:
        EVar14 = 3;
      }
      return EVar14;
    }
    if ((*(byte *)(lVar52 + 2) & 2) != 0) {
      uVar46 = *(uint *)(lVar52 + -8);
      pBVar38 = (BaseRAPass *)(ulong)uVar46;
      pBVar45 = (BaseRAPass *)(pBVar22->super_FuncPass).super_Pass._vptr_Pass;
      if (*(uint *)&pBVar45->field_0x148 <= uVar46) goto LAB_00123a70;
      lVar7 = *(long *)(*(long *)&pBVar45->_workRegs + (long)pBVar38 * 8);
      if (*(char *)(lVar7 + 0x4a) != -1) goto LAB_00123a4a;
      if ((((RAAssignment *)&pBVar22->field_0x48)->_layout).workCount <= uVar46) goto LAB_00123a75;
      bVar25 = ((RAAssignment *)&pBVar22->field_0x48)->_workToPhysMap[(long)pBVar38].physIds[0];
      pBVar36 = (BaseRAPass *)(ulong)bVar25;
      if (bVar25 == 0xff) goto LAB_00123a4a;
      RVar13 = *(RegGroup *)(lVar7 + 0x21);
      (((BaseCompiler *)(pBVar22->super_FuncPass).super_Pass._cb)->super_BaseBuilder)._cursor =
           (BaseNode *)pBStack_4a0;
      if (0x1f < bVar25) goto LAB_00123a7a;
      RVar13 = RVar13 & kMaxValue;
      if (RVar13 < kPC) {
        if (((((RAAssignment *)&pBVar22->field_0x48)->_physToWorkMap->dirty)._masks._data[RVar13] >>
             (bVar25 & 0x1f) & 1) != 0) {
          pBStack_4c8 = (BaseRAPass *)0x123a2d;
          uStack_4b8 = (ulong)RVar13;
          EVar14 = onSaveReg((RALocalAllocator *)pBVar22,RVar13,uVar46,(uint)bVar25);
          RVar13 = (RegGroup)uStack_4b8;
          if (EVar14 != 0) {
            return EVar14;
          }
        }
        pBStack_4c8 = (BaseRAPass *)0x123a45;
        pBVar33 = pBStack_4b0;
        RAAssignment::unassign((RAAssignment *)pBStack_4b0,RVar13,uVar46,(uint)bVar25);
        pIVar39 = pIStack_4a8;
        goto LAB_00123a4a;
      }
      goto LAB_00123a7f;
    }
LAB_00123a4a:
    pIVar54 = pIVar54 + 1;
    lVar52 = lVar52 + 0x20;
    if (pIVar39 == pIVar54) {
      return 0;
    }
  } while( true );
LAB_001230c8:
  pBVar58 = pBVar57;
  pBVar38 = (BaseRAPass *)((long)&(pBVar38->super_FuncPass).super_Pass._vptr_Pass + 1);
  pBVar47 = pBVar22;
  pBVar53 = pBVar28;
  pBVar57 = pBVar58;
  if (pBVar38 == pBStack_3e0) goto LAB_001230d9;
  goto LAB_00122df5;
  while (lVar52 = lVar52 + 0x20, (ulong)bVar25 * 0x20 != lVar52) {
LAB_00123806:
    if (*(uint *)((long)(((RAAssignment *)&pBVar47->field_0x48)->_physToWorkIds)._data +
                 lVar52 + (ulong)(uVar46 << 5) + -0x24) == extraout_EDX_00) {
      if ((*(uint *)((long)(((RAAssignment *)&pBVar47->field_0x48)->_physToWorkIds)._data +
                    lVar52 + (ulong)(uVar46 << 5) + -0x1c) & 0x40008) != 0) {
        EVar14 = 0;
        if (uVar37 != 0) {
          for (; (uVar37 >> EVar14 & 1) == 0; EVar14 = EVar14 + 1) {
          }
          return EVar14;
        }
        return 0;
      }
      break;
    }
  }
LAB_0012382f:
  if ((*(byte *)(lVar18 + 0x24) & 4) != 0) {
    return 0xff;
  }
  uVar37 = ~*(uint *)(lVar18 + 0x38) & uVar37;
  if (uVar37 != 0) {
    uVar46 = ~(((RARegMask *)&pBVar22->field_0x38)->_masks)._data[(ulong)pBVar43 & 0xff] & uVar37;
    if (uVar46 == 0) {
      uVar46 = uVar37;
    }
    EVar14 = 0;
    if (uVar46 != 0) {
      for (; (uVar46 >> EVar14 & 1) == 0; EVar14 = EVar14 + 1) {
      }
      return EVar14;
    }
    return 0;
  }
  return 0xff;
}

Assistant:

Error RALocalAllocator::replaceAssignment(const PhysToWorkMap* physToWorkMap) noexcept {
  _curAssignment.copyFrom(physToWorkMap);
  return kErrorOk;
}